

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDictElement
          (AsciiParser *this,string *out_key,MetaVariable *out_var)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Value *v;
  undefined1 local_e978 [8];
  MetaVariable metavar;
  string local_e920 [32];
  ostringstream local_e900 [8];
  ostringstream ss_e_112;
  string local_e788;
  ostringstream local_e768 [8];
  ostringstream ss_e_111;
  undefined1 local_e5f0 [8];
  Dictionary dict;
  ostringstream local_e5a0 [8];
  ostringstream ss_e_110;
  undefined1 local_e428 [8];
  AssetPath asset;
  ostringstream local_e3c8 [8];
  ostringstream ss_e_109;
  undefined1 local_e250 [8];
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  ostringstream local_e218 [8];
  ostringstream ss_e_108;
  undefined1 local_e0a0 [8];
  StringData str;
  ostringstream local_e050 [8];
  ostringstream ss_e_107;
  undefined1 local_ded8 [8];
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dea0 [39];
  allocator local_de79;
  string local_de78 [32];
  fmt local_de58 [32];
  ostringstream local_de38 [8];
  ostringstream ss_e_106;
  undefined1 local_dcc0 [8];
  texcoord3d val_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc88 [39];
  allocator local_dc61;
  string local_dc60 [32];
  fmt local_dc40 [32];
  ostringstream local_dc20 [8];
  ostringstream ss_e_105;
  undefined1 local_daa8 [8];
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> vss_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da70 [39];
  allocator local_da49;
  string local_da48 [32];
  fmt local_da28 [32];
  ostringstream local_da08 [8];
  ostringstream ss_e_104;
  undefined1 local_d88c [8];
  texcoord3f val_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d860 [39];
  allocator local_d839;
  string local_d838 [32];
  fmt local_d818 [32];
  ostringstream local_d7f8 [8];
  ostringstream ss_e_103;
  undefined1 local_d680 [8];
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> vss_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d648 [39];
  allocator local_d621;
  string local_d620 [32];
  fmt local_d600 [32];
  ostringstream local_d5e0 [8];
  ostringstream ss_e_102;
  texcoord3h local_d466;
  undefined1 local_d460 [2];
  texcoord3h val_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d440 [39];
  allocator local_d419;
  string local_d418 [32];
  fmt local_d3f8 [32];
  ostringstream local_d3d8 [8];
  ostringstream ss_e_101;
  undefined1 local_d260 [8];
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> vss_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d228 [39];
  allocator local_d201;
  string local_d200 [32];
  fmt local_d1e0 [32];
  ostringstream local_d1c0 [8];
  ostringstream ss_e_100;
  undefined1 local_d048 [8];
  texcoord2d val_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d018 [39];
  allocator local_cff1;
  string local_cff0 [32];
  fmt local_cfd0 [32];
  ostringstream local_cfb0 [8];
  ostringstream ss_e_99;
  undefined1 local_ce38 [8];
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> vss_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce00 [39];
  allocator local_cdd9;
  string local_cdd8 [32];
  fmt local_cdb8 [32];
  ostringstream local_cd98 [8];
  ostringstream ss_e_98;
  texcoord2f local_cc20;
  texcoord2f val_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cbf8 [39];
  allocator local_cbd1;
  string local_cbd0 [32];
  fmt local_cbb0 [32];
  ostringstream local_cb90 [8];
  ostringstream ss_e_97;
  undefined1 local_ca18 [8];
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> vss_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c9e0 [39];
  allocator local_c9b9;
  string local_c9b8 [32];
  fmt local_c998 [32];
  ostringstream local_c978 [8];
  ostringstream ss_e_96;
  texcoord2h local_c7fc;
  undefined1 local_c7f8 [4];
  texcoord2h val_46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c7d8 [39];
  allocator local_c7b1;
  string local_c7b0 [32];
  fmt local_c790 [32];
  ostringstream local_c770 [8];
  ostringstream ss_e_95;
  undefined1 local_c5f8 [8];
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> vss_46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c5c0 [39];
  allocator local_c599;
  string local_c598 [32];
  fmt local_c578 [32];
  ostringstream local_c558 [8];
  ostringstream ss_e_94;
  undefined1 local_c3e0 [8];
  color4d val_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c3a0 [39];
  allocator local_c379;
  string local_c378 [32];
  fmt local_c358 [32];
  ostringstream local_c338 [8];
  ostringstream ss_e_93;
  undefined1 local_c1c0 [8];
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> vss_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c188 [39];
  allocator local_c161;
  string local_c160 [32];
  fmt local_c140 [32];
  ostringstream local_c120 [8];
  ostringstream ss_e_92;
  undefined1 local_bfa8 [8];
  color4f val_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf78 [39];
  allocator local_bf51;
  string local_bf50 [32];
  fmt local_bf30 [32];
  ostringstream local_bf10 [8];
  ostringstream ss_e_91;
  undefined1 local_bd98 [8];
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> vss_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd60 [39];
  allocator local_bd39;
  string local_bd38 [32];
  fmt local_bd18 [32];
  ostringstream local_bcf8 [8];
  ostringstream ss_e_90;
  undefined1 local_bb80 [8];
  color3d val_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb48 [39];
  allocator local_bb21;
  string local_bb20 [32];
  fmt local_bb00 [32];
  ostringstream local_bae0 [8];
  ostringstream ss_e_89;
  undefined1 local_b968 [8];
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> vss_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b930 [39];
  allocator local_b909;
  string local_b908 [32];
  fmt local_b8e8 [32];
  ostringstream local_b8c8 [8];
  ostringstream ss_e_88;
  undefined1 local_b74c [8];
  color3f val_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b720 [39];
  allocator local_b6f9;
  string local_b6f8 [32];
  fmt local_b6d8 [32];
  ostringstream local_b6b8 [8];
  ostringstream ss_e_87;
  undefined1 local_b540 [8];
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> vss_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b508 [39];
  allocator local_b4e1;
  string local_b4e0 [32];
  fmt local_b4c0 [32];
  ostringstream local_b4a0 [8];
  ostringstream ss_e_86;
  undefined1 local_b328 [8];
  point3d val_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b2f0 [39];
  allocator local_b2c9;
  string local_b2c8 [32];
  fmt local_b2a8 [32];
  ostringstream local_b288 [8];
  ostringstream ss_e_85;
  undefined1 local_b110 [8];
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> vss_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0d8 [39];
  allocator local_b0b1;
  string local_b0b0 [32];
  fmt local_b090 [32];
  ostringstream local_b070 [8];
  ostringstream ss_e_84;
  undefined1 local_aef4 [8];
  point3f val_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aec8 [39];
  allocator local_aea1;
  string local_aea0 [32];
  fmt local_ae80 [32];
  ostringstream local_ae60 [8];
  ostringstream ss_e_83;
  undefined1 local_ace8 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> vss_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_acb0 [39];
  allocator local_ac89;
  string local_ac88 [32];
  fmt local_ac68 [32];
  ostringstream local_ac48 [8];
  ostringstream ss_e_82;
  point3h local_aace;
  undefined1 local_aac8 [2];
  point3h val_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aaa8 [39];
  allocator local_aa81;
  string local_aa80 [32];
  fmt local_aa60 [32];
  ostringstream local_aa40 [8];
  ostringstream ss_e_81;
  undefined1 local_a8c8 [8];
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> vss_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a890 [39];
  allocator local_a869;
  string local_a868 [32];
  fmt local_a848 [32];
  ostringstream local_a828 [8];
  ostringstream ss_e_80;
  undefined1 local_a6b0 [8];
  vector3d val_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a678 [39];
  allocator local_a651;
  string local_a650 [32];
  fmt local_a630 [32];
  ostringstream local_a610 [8];
  ostringstream ss_e_79;
  undefined1 local_a498 [8];
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> vss_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a460 [39];
  allocator local_a439;
  string local_a438 [32];
  fmt local_a418 [32];
  ostringstream local_a3f8 [8];
  ostringstream ss_e_78;
  undefined1 local_a27c [8];
  vector3f val_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a250 [39];
  allocator local_a229;
  string local_a228 [32];
  fmt local_a208 [32];
  ostringstream local_a1e8 [8];
  ostringstream ss_e_77;
  undefined1 local_a070 [8];
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> vss_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a038 [39];
  allocator local_a011;
  string local_a010 [32];
  fmt local_9ff0 [32];
  ostringstream local_9fd0 [8];
  ostringstream ss_e_76;
  vector3h local_9e56;
  undefined1 local_9e50 [2];
  vector3h val_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e30 [39];
  allocator local_9e09;
  string local_9e08 [32];
  fmt local_9de8 [32];
  ostringstream local_9dc8 [8];
  ostringstream ss_e_75;
  undefined1 local_9c50 [8];
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> vss_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c18 [39];
  allocator local_9bf1;
  string local_9bf0 [32];
  fmt local_9bd0 [32];
  ostringstream local_9bb0 [8];
  ostringstream ss_e_74;
  undefined1 local_9a38 [8];
  normal3d val_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a00 [39];
  allocator local_99d9;
  string local_99d8 [32];
  fmt local_99b8 [32];
  ostringstream local_9998 [8];
  ostringstream ss_e_73;
  undefined1 local_9820 [8];
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> vss_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_97e8 [39];
  allocator local_97c1;
  string local_97c0 [32];
  fmt local_97a0 [32];
  ostringstream local_9780 [8];
  ostringstream ss_e_72;
  undefined1 local_9604 [8];
  normal3f val_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_95d8 [39];
  allocator local_95b1;
  string local_95b0 [32];
  fmt local_9590 [32];
  ostringstream local_9570 [8];
  ostringstream ss_e_71;
  undefined1 local_93f8 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> vss_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_93c0 [39];
  allocator local_9399;
  string local_9398 [32];
  fmt local_9378 [32];
  ostringstream local_9358 [8];
  ostringstream ss_e_70;
  normal3h local_91de;
  undefined1 local_91d8 [2];
  normal3h val_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_91b8 [39];
  allocator local_9191;
  string local_9190 [32];
  fmt local_9170 [32];
  ostringstream local_9150 [8];
  ostringstream ss_e_69;
  undefined1 local_8fd8 [8];
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> vss_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8fa0 [39];
  allocator local_8f79;
  string local_8f78 [32];
  fmt local_8f58 [32];
  ostringstream local_8f38 [8];
  ostringstream ss_e_68;
  undefined1 local_8dc0 [8];
  quatd val_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d80 [39];
  allocator local_8d59;
  string local_8d58 [32];
  fmt local_8d38 [32];
  ostringstream local_8d18 [8];
  ostringstream ss_e_67;
  undefined1 local_8ba0 [8];
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> vss_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b68 [39];
  allocator local_8b41;
  string local_8b40 [32];
  fmt local_8b20 [32];
  ostringstream local_8b00 [8];
  ostringstream ss_e_66;
  undefined1 local_8988 [8];
  quatf val_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8958 [39];
  allocator local_8931;
  string local_8930 [32];
  fmt local_8910 [32];
  ostringstream local_88f0 [8];
  ostringstream ss_e_65;
  undefined1 local_8778 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> vss_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8740 [39];
  allocator local_8719;
  string local_8718 [32];
  fmt local_86f8 [32];
  ostringstream local_86d8 [8];
  ostringstream ss_e_64;
  quath local_8560;
  quath val_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8538 [39];
  allocator local_8511;
  string local_8510 [32];
  fmt local_84f0 [32];
  ostringstream local_84d0 [8];
  ostringstream ss_e_63;
  undefined1 local_8358 [8];
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> vss_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8320 [39];
  allocator local_82f9;
  string local_82f8 [32];
  fmt local_82d8 [32];
  ostringstream local_82b8 [8];
  ostringstream ss_e_62;
  undefined1 local_8140 [8];
  matrix4d val_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80a0 [39];
  allocator local_8079;
  string local_8078 [32];
  fmt local_8058 [32];
  ostringstream local_8038 [8];
  ostringstream ss_e_61;
  undefined1 local_7ec0 [8];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> vss_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e88 [39];
  allocator local_7e61;
  string local_7e60 [32];
  fmt local_7e40 [32];
  ostringstream local_7e20 [8];
  ostringstream ss_e_60;
  undefined1 local_7ca8 [8];
  matrix3d val_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c40 [39];
  allocator local_7c19;
  string local_7c18 [32];
  fmt local_7bf8 [32];
  ostringstream local_7bd8 [8];
  ostringstream ss_e_59;
  undefined1 local_7a60 [8];
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> vss_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a28 [39];
  allocator local_7a01;
  string local_7a00 [32];
  fmt local_79e0 [32];
  ostringstream local_79c0 [8];
  ostringstream ss_e_58;
  undefined1 local_7848 [8];
  matrix2d val_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7808 [39];
  allocator local_77e1;
  string local_77e0 [32];
  fmt local_77c0 [32];
  ostringstream local_77a0 [8];
  ostringstream ss_e_57;
  undefined1 local_7628 [8];
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> vss_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_75f0 [39];
  allocator local_75c9;
  string local_75c8 [32];
  fmt local_75a8 [32];
  ostringstream local_7588 [8];
  ostringstream ss_e_56;
  undefined1 local_7410 [8];
  matrix4f val_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_73b0 [39];
  allocator local_7389;
  string local_7388 [32];
  fmt local_7368 [32];
  ostringstream local_7348 [8];
  ostringstream ss_e_55;
  undefined1 local_71d0 [8];
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> vss_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7198 [39];
  allocator local_7171;
  string local_7170 [32];
  fmt local_7150 [32];
  ostringstream local_7130 [8];
  ostringstream ss_e_54;
  undefined1 local_6fb4 [8];
  matrix3f val_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f70 [39];
  allocator local_6f49;
  string local_6f48 [32];
  fmt local_6f28 [32];
  ostringstream local_6f08 [8];
  ostringstream ss_e_53;
  undefined1 local_6d90 [8];
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> vss_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d58 [39];
  allocator local_6d31;
  string local_6d30 [32];
  fmt local_6d10 [32];
  ostringstream local_6cf0 [8];
  ostringstream ss_e_52;
  undefined1 local_6b78 [8];
  matrix2f val_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b48 [39];
  allocator local_6b21;
  string local_6b20 [32];
  fmt local_6b00 [32];
  ostringstream local_6ae0 [8];
  ostringstream ss_e_51;
  undefined1 local_6968 [8];
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> vss_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6930 [39];
  allocator local_6909;
  string local_6908 [32];
  fmt local_68e8 [32];
  ostringstream local_68c8 [8];
  ostringstream ss_e_50;
  undefined1 local_6750 [8];
  double4 val_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6710 [39];
  allocator local_66e9;
  string local_66e8 [32];
  fmt local_66c8 [32];
  ostringstream local_66a8 [8];
  ostringstream ss_e_49;
  undefined1 local_6530 [8];
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> vss_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_64f8 [39];
  allocator local_64d1;
  string local_64d0 [32];
  fmt local_64b0 [32];
  ostringstream local_6490 [8];
  ostringstream ss_e_48;
  undefined1 local_6318 [8];
  double3 val_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_62e0 [39];
  allocator local_62b9;
  string local_62b8 [32];
  fmt local_6298 [32];
  ostringstream local_6278 [8];
  ostringstream ss_e_47;
  undefined1 local_6100 [8];
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> vss_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60c8 [39];
  allocator local_60a1;
  string local_60a0 [32];
  fmt local_6080 [32];
  ostringstream local_6060 [8];
  ostringstream ss_e_46;
  undefined1 local_5ee8 [8];
  double2 val_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5eb8 [39];
  allocator local_5e91;
  string local_5e90 [32];
  fmt local_5e70 [32];
  ostringstream local_5e50 [8];
  ostringstream ss_e_45;
  undefined1 local_5cd8 [8];
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> vss_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5ca0 [39];
  allocator local_5c79;
  string local_5c78 [32];
  fmt local_5c58 [32];
  ostringstream local_5c38 [8];
  ostringstream ss_e_44;
  double local_5ac0;
  double val_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a98 [39];
  allocator local_5a71;
  string local_5a70 [32];
  fmt local_5a50 [32];
  ostringstream local_5a30 [8];
  ostringstream ss_e_43;
  undefined1 local_58b8 [8];
  vector<double,_std::allocator<double>_> vss_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5880 [39];
  allocator local_5859;
  string local_5858 [32];
  fmt local_5838 [32];
  ostringstream local_5818 [8];
  ostringstream ss_e_42;
  undefined1 local_56a0 [8];
  float4 val_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5670 [39];
  allocator local_5649;
  string local_5648 [32];
  fmt local_5628 [32];
  ostringstream local_5608 [8];
  ostringstream ss_e_41;
  undefined1 local_5490 [8];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> vss_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5458 [39];
  allocator local_5431;
  string local_5430 [32];
  fmt local_5410 [32];
  ostringstream local_53f0 [8];
  ostringstream ss_e_40;
  undefined1 local_5274 [8];
  float3 val_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5248 [39];
  allocator local_5221;
  string local_5220 [32];
  fmt local_5200 [32];
  ostringstream local_51e0 [8];
  ostringstream ss_e_39;
  undefined1 local_5068 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vss_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5030 [39];
  allocator local_5009;
  string local_5008 [32];
  fmt local_4fe8 [32];
  ostringstream local_4fc8 [8];
  ostringstream ss_e_38;
  float2 local_4e50;
  float2 val_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e28 [39];
  allocator local_4e01;
  string local_4e00 [32];
  fmt local_4de0 [32];
  ostringstream local_4dc0 [8];
  ostringstream ss_e_37;
  undefined1 local_4c48 [8];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> vss_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c10 [39];
  allocator local_4be9;
  string local_4be8 [32];
  fmt local_4bc8 [32];
  ostringstream local_4ba8 [8];
  ostringstream ss_e_36;
  float local_4a2c;
  undefined1 local_4a28 [4];
  float val_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a08 [39];
  allocator local_49e1;
  string local_49e0 [32];
  fmt local_49c0 [32];
  ostringstream local_49a0 [8];
  ostringstream ss_e_35;
  undefined1 local_4828 [8];
  vector<float,_std::allocator<float>_> vss_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_47f0 [39];
  allocator local_47c9;
  string local_47c8 [32];
  fmt local_47a8 [32];
  ostringstream local_4788 [8];
  ostringstream ss_e_34;
  uint64_t local_4610;
  uint64_t val_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_45e8 [39];
  allocator local_45c1;
  string local_45c0 [32];
  fmt local_45a0 [32];
  ostringstream local_4580 [8];
  ostringstream ss_e_33;
  undefined1 local_4408 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vss_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_43d0 [39];
  allocator local_43a9;
  string local_43a8 [32];
  fmt local_4388 [32];
  ostringstream local_4368 [8];
  ostringstream ss_e_32;
  int64_t local_41f0;
  int64_t val_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41c8 [39];
  allocator local_41a1;
  string local_41a0 [32];
  fmt local_4180 [32];
  ostringstream local_4160 [8];
  ostringstream ss_e_31;
  undefined1 local_3fe8 [8];
  vector<long,_std::allocator<long>_> vss_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3fb0 [39];
  allocator local_3f89;
  string local_3f88 [32];
  fmt local_3f68 [32];
  ostringstream local_3f48 [8];
  ostringstream ss_e_30;
  undefined1 local_3dd0 [8];
  uint4 val_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3da0 [39];
  allocator local_3d79;
  string local_3d78 [32];
  fmt local_3d58 [32];
  ostringstream local_3d38 [8];
  ostringstream ss_e_29;
  undefined1 local_3bc0 [8];
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> vss_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b88 [39];
  allocator local_3b61;
  string local_3b60 [32];
  fmt local_3b40 [32];
  ostringstream local_3b20 [8];
  ostringstream ss_e_28;
  undefined1 local_39a4 [8];
  uint3 val_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3978 [39];
  allocator local_3951;
  string local_3950 [32];
  fmt local_3930 [32];
  ostringstream local_3910 [8];
  ostringstream ss_e_27;
  undefined1 local_3798 [8];
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> vss_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3760 [39];
  allocator local_3739;
  string local_3738 [32];
  fmt local_3718 [32];
  ostringstream local_36f8 [8];
  ostringstream ss_e_26;
  uint2 local_3580;
  uint2 val_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3558 [39];
  allocator local_3531;
  string local_3530 [32];
  fmt local_3510 [32];
  ostringstream local_34f0 [8];
  ostringstream ss_e_25;
  undefined1 local_3378 [8];
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vss_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3340 [39];
  allocator local_3319;
  string local_3318 [32];
  fmt local_32f8 [32];
  ostringstream local_32d8 [8];
  ostringstream ss_e_24;
  undefined1 local_3160 [8];
  int4 val_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3130 [39];
  allocator local_3109;
  string local_3108 [32];
  fmt local_30e8 [32];
  ostringstream local_30c8 [8];
  ostringstream ss_e_23;
  undefined1 local_2f50 [8];
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vss_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f18 [39];
  allocator local_2ef1;
  string local_2ef0 [32];
  fmt local_2ed0 [32];
  ostringstream local_2eb0 [8];
  ostringstream ss_e_22;
  undefined1 local_2d34 [8];
  int3 val_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d08 [39];
  allocator local_2ce1;
  string local_2ce0 [32];
  fmt local_2cc0 [32];
  ostringstream local_2ca0 [8];
  ostringstream ss_e_21;
  undefined1 local_2b28 [8];
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> vss_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2af0 [39];
  allocator local_2ac9;
  string local_2ac8 [32];
  fmt local_2aa8 [32];
  ostringstream local_2a88 [8];
  ostringstream ss_e_20;
  int2 local_2910;
  int2 val_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28e8 [39];
  allocator local_28c1;
  string local_28c0 [32];
  fmt local_28a0 [32];
  ostringstream local_2880 [8];
  ostringstream ss_e_19;
  undefined1 local_2708 [8];
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> vss_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26d0 [39];
  allocator local_26a9;
  string local_26a8 [32];
  fmt local_2688 [32];
  ostringstream local_2668 [8];
  ostringstream ss_e_18;
  uint32_t local_24ec;
  undefined1 local_24e8 [4];
  uint32_t val_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24c8 [39];
  allocator local_24a1;
  string local_24a0 [32];
  fmt local_2480 [32];
  ostringstream local_2460 [8];
  ostringstream ss_e_17;
  undefined1 local_22e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vss_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22b0 [39];
  allocator local_2289;
  string local_2288 [32];
  fmt local_2268 [32];
  ostringstream local_2248 [8];
  ostringstream ss_e_16;
  int local_20cc;
  undefined1 local_20c8 [4];
  int32_t val_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a8 [39];
  allocator local_2081;
  string local_2080 [32];
  fmt local_2060 [32];
  ostringstream local_2040 [8];
  ostringstream ss_e_15;
  undefined1 local_1ec8 [8];
  vector<int,_std::allocator<int>_> vss_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e90 [39];
  allocator local_1e69;
  string local_1e68 [32];
  fmt local_1e48 [32];
  ostringstream local_1e28 [8];
  ostringstream ss_e_14;
  half4 local_1cb0;
  half4 val_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c88 [39];
  allocator local_1c61;
  string local_1c60 [32];
  fmt local_1c40 [32];
  ostringstream local_1c20 [8];
  ostringstream ss_e_13;
  undefined1 local_1aa8 [8];
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  vss_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a70 [39];
  allocator local_1a49;
  string local_1a48 [32];
  fmt local_1a28 [32];
  ostringstream local_1a08 [8];
  ostringstream ss_e_12;
  half3 local_188e;
  undefined1 local_1888 [2];
  half3 val_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1868 [39];
  allocator local_1841;
  string local_1840 [32];
  fmt local_1820 [32];
  ostringstream local_1800 [8];
  ostringstream ss_e_11;
  undefined1 local_1688 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  vss_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1650 [39];
  allocator local_1629;
  string local_1628 [32];
  fmt local_1608 [32];
  ostringstream local_15e8 [8];
  ostringstream ss_e_10;
  half2 local_146c;
  undefined1 local_1468 [4];
  half2 val_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448 [39];
  allocator local_1421;
  string local_1420 [32];
  fmt local_1400 [32];
  ostringstream local_13e0 [8];
  ostringstream ss_e_9;
  undefined1 local_1268 [8];
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  vss_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230 [39];
  allocator local_1209;
  string local_1208 [32];
  fmt local_11e8 [32];
  ostringstream local_11c8 [8];
  ostringstream ss_e_8;
  half local_104a;
  undefined1 local_1048 [6];
  half val_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028 [39];
  allocator local_1001;
  string local_1000 [32];
  fmt local_fe0 [32];
  ostringstream local_fc0 [8];
  ostringstream ss_e_7;
  undefined1 local_e48 [8];
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> vss_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10 [39];
  allocator local_de9;
  string local_de8 [32];
  fmt local_dc8 [32];
  ostringstream local_da8 [8];
  ostringstream ss_e_6;
  bool local_c29;
  undefined1 local_c28 [7];
  bool val_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08 [39];
  allocator local_be1;
  string local_be0 [32];
  fmt local_bc0 [32];
  ostringstream local_ba0 [8];
  ostringstream ss_e_5;
  undefined1 local_a28 [8];
  vector<bool,_std::allocator<bool>_> vss_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  fmt local_998 [32];
  ostringstream local_978 [8];
  ostringstream ss_e_4;
  undefined1 local_800 [8];
  token val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0 [39];
  allocator local_799;
  string local_798 [32];
  fmt local_778 [32];
  ostringstream local_758 [8];
  ostringstream ss_e_3;
  undefined1 local_5e0 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  PrimVar var;
  undefined1 local_580 [4];
  uint32_t tyid;
  ostringstream local_560 [8];
  ostringstream ss_e_2;
  undefined1 local_3e8 [8];
  string key_name;
  ostringstream local_3a8 [8];
  ostringstream ss_e_1;
  char local_22b;
  char local_22a;
  byte local_229;
  undefined1 local_228 [5];
  char c1;
  char c0;
  bool array_qual;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  int local_4c;
  undefined1 local_48 [8];
  string type_name;
  MetaVariable *out_var_local;
  string *out_key_local;
  AsciiParser *this_local;
  
  type_name.field_2._8_8_ = out_var;
  ::std::__cxx11::string::string((string *)local_48);
  bVar1 = ReadIdentifier(this,(string *)local_48);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004ea361;
  }
  bVar1 = SkipWhitespace(this);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004ea361;
  }
  bVar1 = IsSupportedPrimAttrType(this,(string *)local_48);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2fa);
    ::std::operator<<(poVar3," ");
    ::std::operator+((char *)local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unknown or unsupported type `");
    ::std::operator+(local_1e8,(char *)local_208);
    poVar3 = ::std::operator<<((ostream *)local_1c8,(string *)local_1e8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_1e8);
    ::std::__cxx11::string::~string(local_208);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)local_228);
    ::std::__cxx11::string::~string((string *)local_228);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
    goto LAB_004ea361;
  }
  local_229 = 0;
  bVar1 = Char1(this,&local_22a);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004ea361;
  }
  if (local_22a == '[') {
    bVar1 = Char1(this,&local_22b);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_004ea361;
    }
    if (local_22b != ']') {
      ::std::__cxx11::ostringstream::ostringstream(local_3a8);
      poVar3 = ::std::operator<<((ostream *)local_3a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x30e);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_3a8,"Invalid syntax found.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)((long)&key_name.field_2 + 8));
      ::std::__cxx11::string::~string((string *)(key_name.field_2._M_local_buf + 8));
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_3a8);
      goto LAB_004ea361;
    }
    local_229 = 1;
  }
  else {
    bVar1 = Rewind(this,1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_004ea361;
    }
  }
  bVar1 = SkipWhitespace(this);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004ea361;
  }
  ::std::__cxx11::string::string((string *)local_3e8);
  bVar1 = ReadIdentifier(this,(string *)local_3e8);
  if ((bVar1) || (bVar1 = ReadStringLiteral(this,(string *)local_3e8), bVar1)) {
    bVar1 = SkipWhitespace(this);
    if (bVar1) {
      bVar1 = Expect(this,'=');
      if (bVar1) {
        bVar1 = SkipWhitespace(this);
        if (bVar1) {
          uVar2 = tinyusdz::value::GetTypeId((string *)local_48);
          primvar::PrimVar::PrimVar
                    ((PrimVar *)
                     &vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          switch(uVar2) {
          case 6:
            if ((local_229 & 1) == 0) {
              Token::Token((Token *)local_800);
              bVar1 = ReadBasicType(this,(token *)local_800);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::Token>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(Token *)local_800);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_978);
                poVar3 = ::std::operator<<((ostream *)local_978,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_9b8,"Failed to parse a value of type `{}`",&local_9b9);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_998,(string *)local_9b8,local_9e0);
                poVar3 = ::std::operator<<((ostream *)local_978,(string *)local_998);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_998);
                ::std::__cxx11::string::~string((string *)local_9e0);
                ::std::__cxx11::string::~string(local_9b8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)
                               &vss_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage);
                ::std::__cxx11::string::~string
                          ((string *)
                           &vss_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_978);
              }
              Token::~Token((Token *)local_800);
              if (bVar1) goto LAB_004ea2e4;
            }
            else {
              ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_5e0);
              bVar1 = ParseBasicTypeArray<tinyusdz::Token>
                                (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_5e0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_5e0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_758);
                poVar3 = ::std::operator<<((ostream *)local_758,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_798,"Failed to parse a value of type `{}[]`",&local_799);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_778,(string *)local_798,local_7c0);
                poVar3 = ::std::operator<<((ostream *)local_758,(string *)local_778);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_778);
                ::std::__cxx11::string::~string((string *)local_7c0);
                ::std::__cxx11::string::~string(local_798);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)((long)&val.str_.field_2 + 8));
                ::std::__cxx11::string::~string((string *)(val.str_.field_2._M_local_buf + 8));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_758);
              }
              ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_5e0);
              if (bVar1) {
LAB_004ea2e4:
                MetaVariable::MetaVariable((MetaVariable *)local_e978);
                v = primvar::PrimVar::value_raw
                              ((PrimVar *)
                               &vss.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                MetaVariable::set_value<tinyusdz::value::Value>
                          ((MetaVariable *)local_e978,(string *)local_3e8,v);
                ::std::__cxx11::string::operator=((string *)out_key,(string *)local_3e8);
                MetaVariable::operator=
                          ((MetaVariable *)type_name.field_2._8_8_,(MetaVariable *)local_e978);
                this_local._7_1_ = 1;
                MetaVariable::~MetaVariable((MetaVariable *)local_e978);
              }
            }
            break;
          case 7:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::StringData::StringData((StringData *)local_e0a0);
              bVar1 = ReadBasicType(this,(StringData *)local_e0a0);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::StringData>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (StringData *)local_e0a0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_e218);
                poVar3 = ::std::operator<<((ostream *)local_e218,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x35f);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_e218,"Failed to parse `string`");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)
                               &arrs.
                                super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::__cxx11::string::~string
                          ((string *)
                           &arrs.
                            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_e218);
              }
              tinyusdz::value::StringData::~StringData((StringData *)local_e0a0);
              if (bVar1) goto LAB_004ea2e4;
            }
            else {
              ::std::
              vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
              vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      *)local_ded8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::StringData>
                                (this,(vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                       *)local_ded8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::StringData,std::allocator<tinyusdz::value::StringData>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                            *)local_ded8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_e050);
                poVar3 = ::std::operator<<((ostream *)local_e050,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x359);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_e050,"Failed to parse `string[]`");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&str.line_col);
                ::std::__cxx11::string::~string((string *)&str.line_col);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_e050);
              }
              ::std::
              vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
              ~vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                       *)local_ded8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          default:
            ::std::__cxx11::ostringstream::ostringstream(local_e900);
            poVar3 = ::std::operator<<((ostream *)local_e900,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x381);
            ::std::operator<<(poVar3," ");
            ::std::operator+((char *)local_e920,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Unsupported or invalid type for Metadatum:");
            poVar3 = ::std::operator<<((ostream *)local_e900,local_e920);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string(local_e920);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&metavar._name.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(metavar._name.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_e900);
            break;
          case 9:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_c29);
              if (bVar1) {
                primvar::PrimVar::set_value<bool>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c29);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_da8);
              poVar3 = ::std::operator<<((ostream *)local_da8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_de8,"Failed to parse a value of type `{}`",&local_de9);
              tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_dc8,(string *)local_de8,local_e10);
              poVar3 = ::std::operator<<((ostream *)local_da8,(string *)local_dc8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_dc8);
              ::std::__cxx11::string::~string((string *)local_e10);
              ::std::__cxx11::string::~string(local_de8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_de9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_2.
                              super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_2.
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_da8);
            }
            else {
              ::std::vector<bool,_std::allocator<bool>_>::vector
                        ((vector<bool,_std::allocator<bool>_> *)local_a28);
              bVar1 = ParseBasicTypeArray<bool>
                                (this,(vector<bool,_std::allocator<bool>_> *)local_a28);
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<bool,std::allocator<bool>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<bool,_std::allocator<bool>_> *)local_a28);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_ba0);
                poVar3 = ::std::operator<<((ostream *)local_ba0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_be0,"Failed to parse a value of type `{}[]`",&local_be1);
                tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_bc0,(string *)local_be0,local_c08);
                poVar3 = ::std::operator<<((ostream *)local_ba0,(string *)local_bc0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_bc0);
                ::std::__cxx11::string::~string((string *)local_c08);
                ::std::__cxx11::string::~string(local_be0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_be1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_c28);
                ::std::__cxx11::string::~string((string *)local_c28);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_ba0);
              }
              ::std::vector<bool,_std::allocator<bool>_>::~vector
                        ((vector<bool,_std::allocator<bool>_> *)local_a28);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0xe:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_104a);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::half>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_104a);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_11c8);
              poVar3 = ::std::operator<<((ostream *)local_11c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1208,"Failed to parse a value of type `{}`",&local_1209);
              tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_11e8,(string *)local_1208,local_1230);
              poVar3 = ::std::operator<<((ostream *)local_11c8,(string *)local_11e8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_11e8);
              ::std::__cxx11::string::~string((string *)local_1230);
              ::std::__cxx11::string::~string(local_1208);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1209);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_3.
                              super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_3.
                          super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_11c8);
            }
            else {
              ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                        ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         local_e48);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                                (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                       *)local_e48);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                           local_e48);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_fc0);
                poVar3 = ::std::operator<<((ostream *)local_fc0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1000,"Failed to parse a value of type `{}[]`",&local_1001);
                tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_fe0,(string *)local_1000,local_1028);
                poVar3 = ::std::operator<<((ostream *)local_fc0,(string *)local_fe0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_fe0);
                ::std::__cxx11::string::~string((string *)local_1028);
                ::std::__cxx11::string::~string(local_1000);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1001);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_1048);
                ::std::__cxx11::string::~string((string *)local_1048);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_fc0);
              }
              ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                        ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         local_e48);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0xf:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_20cc);
              if (bVar1) {
                primvar::PrimVar::set_value<int>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_20cc);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_2248);
              poVar3 = ::std::operator<<((ostream *)local_2248,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_2288,"Failed to parse a value of type `{}`",&local_2289);
              tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_2268,(string *)local_2288,local_22b0);
              poVar3 = ::std::operator<<((ostream *)local_2248,(string *)local_2268);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_2268);
              ::std::__cxx11::string::~string((string *)local_22b0);
              ::std::__cxx11::string::~string(local_2288);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2289);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_2248);
            }
            else {
              ::std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_1ec8);
              bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)local_1ec8)
              ;
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<int,std::allocator<int>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<int,_std::allocator<int>_> *)local_1ec8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_2040);
                poVar3 = ::std::operator<<((ostream *)local_2040,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_2080,"Failed to parse a value of type `{}[]`",&local_2081);
                tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_2060,(string *)local_2080,local_20a8);
                poVar3 = ::std::operator<<((ostream *)local_2040,(string *)local_2060);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_2060);
                ::std::__cxx11::string::~string((string *)local_20a8);
                ::std::__cxx11::string::~string(local_2080);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_2081);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_20c8);
                ::std::__cxx11::string::~string((string *)local_20c8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_2040);
              }
              ::std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)local_1ec8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x10:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_41f0);
              if (bVar1) {
                primvar::PrimVar::set_value<long>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_41f0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_4368);
              poVar3 = ::std::operator<<((ostream *)local_4368,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_43a8,"Failed to parse a value of type `{}`",&local_43a9);
              tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_4388,(string *)local_43a8,local_43d0);
              poVar3 = ::std::operator<<((ostream *)local_4368,(string *)local_4388);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_4388);
              ::std::__cxx11::string::~string((string *)local_43d0);
              ::std::__cxx11::string::~string(local_43a8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_43a9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_15.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_4368);
            }
            else {
              ::std::vector<long,_std::allocator<long>_>::vector
                        ((vector<long,_std::allocator<long>_> *)local_3fe8);
              bVar1 = ParseBasicTypeArray<long>
                                (this,(vector<long,_std::allocator<long>_> *)local_3fe8);
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<long,std::allocator<long>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<long,_std::allocator<long>_> *)local_3fe8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_4160);
                poVar3 = ::std::operator<<((ostream *)local_4160,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_41a0,"Failed to parse a value of type `{}[]`",&local_41a1);
                tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_4180,(string *)local_41a0,local_41c8);
                poVar3 = ::std::operator<<((ostream *)local_4160,(string *)local_4180);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_4180);
                ::std::__cxx11::string::~string((string *)local_41c8);
                ::std::__cxx11::string::~string(local_41a0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_41a1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_14);
                ::std::__cxx11::string::~string((string *)&val_14);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_4160);
              }
              ::std::vector<long,_std::allocator<long>_>::~vector
                        ((vector<long,_std::allocator<long>_> *)local_3fe8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x11:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_146c);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<tinyusdz::value::half,2ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_146c);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_15e8);
              poVar3 = ::std::operator<<((ostream *)local_15e8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1628,"Failed to parse a value of type `{}`",&local_1629);
              tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::
              type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_1608,(string *)local_1628,local_1650);
              poVar3 = ::std::operator<<((ostream *)local_15e8,(string *)local_1608);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_1608);
              ::std::__cxx11::string::~string((string *)local_1650);
              ::std::__cxx11::string::~string(local_1628);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1629);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_4.
                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_4.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_15e8);
            }
            else {
              ::std::
              vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)local_1268);
              bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                                (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                       *)local_1268);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                            *)local_1268);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_13e0);
                poVar3 = ::std::operator<<((ostream *)local_13e0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1420,"Failed to parse a value of type `{}[]`",&local_1421);
                tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::
                type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_1400,(string *)local_1420,local_1448);
                poVar3 = ::std::operator<<((ostream *)local_13e0,(string *)local_1400);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1400);
                ::std::__cxx11::string::~string((string *)local_1448);
                ::std::__cxx11::string::~string(local_1420);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1421);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_1468);
                ::std::__cxx11::string::~string((string *)local_1468);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_13e0);
              }
              ::std::
              vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         *)local_1268);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x12:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_188e);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<tinyusdz::value::half,3ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_188e);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1a08);
              poVar3 = ::std::operator<<((ostream *)local_1a08,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1a48,"Failed to parse a value of type `{}`",&local_1a49);
              tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::
              type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_1a28,(string *)local_1a48,local_1a70);
              poVar3 = ::std::operator<<((ostream *)local_1a08,(string *)local_1a28);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_1a28);
              ::std::__cxx11::string::~string((string *)local_1a70);
              ::std::__cxx11::string::~string(local_1a48);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1a49);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_5.
                              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_5.
                          super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_1a08);
            }
            else {
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)local_1688);
              bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                                (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                       *)local_1688);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)local_1688);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1800);
                poVar3 = ::std::operator<<((ostream *)local_1800,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1840,"Failed to parse a value of type `{}[]`",&local_1841);
                tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::
                type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_1820,(string *)local_1840,local_1868);
                poVar3 = ::std::operator<<((ostream *)local_1800,(string *)local_1820);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1820);
                ::std::__cxx11::string::~string((string *)local_1868);
                ::std::__cxx11::string::~string(local_1840);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1841);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_1888);
                ::std::__cxx11::string::~string((string *)local_1888);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_1800);
              }
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)local_1688);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x13:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_1cb0);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<tinyusdz::value::half,4ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1cb0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1e28);
              poVar3 = ::std::operator<<((ostream *)local_1e28,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1e68,"Failed to parse a value of type `{}`",&local_1e69);
              tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::
              type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_1e48,(string *)local_1e68,local_1e90);
              poVar3 = ::std::operator<<((ostream *)local_1e28,(string *)local_1e48);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_1e48);
              ::std::__cxx11::string::~string((string *)local_1e90);
              ::std::__cxx11::string::~string(local_1e68);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1e69);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_1e28);
            }
            else {
              ::std::
              vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        *)local_1aa8);
              bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                                (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                       *)local_1aa8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                            *)local_1aa8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1c20);
                poVar3 = ::std::operator<<((ostream *)local_1c20,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1c60,"Failed to parse a value of type `{}[]`",&local_1c61);
                tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::
                type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_1c40,(string *)local_1c60,local_1c88);
                poVar3 = ::std::operator<<((ostream *)local_1c20,(string *)local_1c40);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1c40);
                ::std::__cxx11::string::~string((string *)local_1c88);
                ::std::__cxx11::string::~string(local_1c60);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_5);
                ::std::__cxx11::string::~string((string *)&val_5);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_1c20);
              }
              ::std::
              vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         *)local_1aa8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x14:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_2910);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<int,2ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2910);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_2a88);
              poVar3 = ::std::operator<<((ostream *)local_2a88,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_2ac8,"Failed to parse a value of type `{}`",&local_2ac9);
              tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_2aa8,(string *)local_2ac8,local_2af0);
              poVar3 = ::std::operator<<((ostream *)local_2a88,(string *)local_2aa8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_2aa8);
              ::std::__cxx11::string::~string((string *)local_2af0);
              ::std::__cxx11::string::~string(local_2ac8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2ac9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_9.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_9.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_2a88);
            }
            else {
              ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                        ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                         local_2708);
              bVar1 = ParseBasicTypeArray<std::array<int,2ul>>
                                (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                       *)local_2708);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                           local_2708);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_2880);
                poVar3 = ::std::operator<<((ostream *)local_2880,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_28c0,"Failed to parse a value of type `{}[]`",&local_28c1);
                tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_28a0,(string *)local_28c0,local_28e8);
                poVar3 = ::std::operator<<((ostream *)local_2880,(string *)local_28a0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_28a0);
                ::std::__cxx11::string::~string((string *)local_28e8);
                ::std::__cxx11::string::~string(local_28c0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_8);
                ::std::__cxx11::string::~string((string *)&val_8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_2880);
              }
              ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                        ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                         local_2708);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x15:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(int3 *)local_2d34);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<int,3ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<int,_3UL> *)local_2d34);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_2eb0);
              poVar3 = ::std::operator<<((ostream *)local_2eb0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_2ef0,"Failed to parse a value of type `{}`",&local_2ef1);
              tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_2ed0,(string *)local_2ef0,local_2f18);
              poVar3 = ::std::operator<<((ostream *)local_2eb0,(string *)local_2ed0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_2ed0);
              ::std::__cxx11::string::~string((string *)local_2f18);
              ::std::__cxx11::string::~string(local_2ef0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_10.
                              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_10.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_2eb0);
            }
            else {
              ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                        ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         local_2b28);
              bVar1 = ParseBasicTypeArray<std::array<int,3ul>>
                                (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                       *)local_2b28);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           local_2b28);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_2ca0);
                poVar3 = ::std::operator<<((ostream *)local_2ca0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_2ce0,"Failed to parse a value of type `{}[]`",&local_2ce1);
                tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_2cc0,(string *)local_2ce0,local_2d08);
                poVar3 = ::std::operator<<((ostream *)local_2ca0,(string *)local_2cc0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_2cc0);
                ::std::__cxx11::string::~string((string *)local_2d08);
                ::std::__cxx11::string::~string(local_2ce0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_2ce1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_9._M_elems + 1));
                ::std::__cxx11::string::~string((string *)(val_9._M_elems + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_2ca0);
              }
              ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                        ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         local_2b28);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x16:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(int4 *)local_3160);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<int,4ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<int,_4UL> *)local_3160);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_32d8);
              poVar3 = ::std::operator<<((ostream *)local_32d8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_3318,"Failed to parse a value of type `{}`",&local_3319);
              tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_32f8,(string *)local_3318,local_3340);
              poVar3 = ::std::operator<<((ostream *)local_32d8,(string *)local_32f8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_32f8);
              ::std::__cxx11::string::~string((string *)local_3340);
              ::std::__cxx11::string::~string(local_3318);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_3319);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_11.
                              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_11.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_32d8);
            }
            else {
              ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                        ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                         local_2f50);
              bVar1 = ParseBasicTypeArray<std::array<int,4ul>>
                                (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                       *)local_2f50);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                           local_2f50);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_30c8);
                poVar3 = ::std::operator<<((ostream *)local_30c8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3108,"Failed to parse a value of type `{}[]`",&local_3109);
                tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_30e8,(string *)local_3108,local_3130);
                poVar3 = ::std::operator<<((ostream *)local_30c8,(string *)local_30e8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_30e8);
                ::std::__cxx11::string::~string((string *)local_3130);
                ::std::__cxx11::string::~string(local_3108);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3109);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_10._M_elems + 2));
                ::std::__cxx11::string::~string((string *)(val_10._M_elems + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_30c8);
              }
              ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                        ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                         local_2f50);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x1b:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_24ec);
              if (bVar1) {
                primvar::PrimVar::set_value<unsigned_int>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_24ec);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_2668);
              poVar3 = ::std::operator<<((ostream *)local_2668,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_26a8,"Failed to parse a value of type `{}`",&local_26a9);
              tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_2688,(string *)local_26a8,local_26d0);
              poVar3 = ::std::operator<<((ostream *)local_2668,(string *)local_2688);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_2688);
              ::std::__cxx11::string::~string((string *)local_26d0);
              ::std::__cxx11::string::~string(local_26a8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_26a9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_8.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_8.
                          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_2668);
            }
            else {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_22e8);
              bVar1 = ParseBasicTypeArray<unsigned_int>
                                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_22e8);
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_22e8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_2460);
                poVar3 = ::std::operator<<((ostream *)local_2460,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_24a0,"Failed to parse a value of type `{}[]`",&local_24a1);
                tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_2480,(string *)local_24a0,local_24c8);
                poVar3 = ::std::operator<<((ostream *)local_2460,(string *)local_2480);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_2480);
                ::std::__cxx11::string::~string((string *)local_24c8);
                ::std::__cxx11::string::~string(local_24a0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_24a1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_24e8);
                ::std::__cxx11::string::~string((string *)local_24e8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_2460);
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_22e8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x1c:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_4610);
              if (bVar1) {
                primvar::PrimVar::set_value<unsigned_long>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4610);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_4788);
              poVar3 = ::std::operator<<((ostream *)local_4788,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_47c8,"Failed to parse a value of type `{}`",&local_47c9);
              tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_47a8,(string *)local_47c8,local_47f0);
              poVar3 = ::std::operator<<((ostream *)local_4788,(string *)local_47a8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_47a8);
              ::std::__cxx11::string::~string((string *)local_47f0);
              ::std::__cxx11::string::~string(local_47c8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_47c9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_16.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_16.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_4788);
            }
            else {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4408);
              bVar1 = ParseBasicTypeArray<unsigned_long>
                                (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      local_4408);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4408);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_4580);
                poVar3 = ::std::operator<<((ostream *)local_4580,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_45c0,"Failed to parse a value of type `{}[]`",&local_45c1);
                tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_45a0,(string *)local_45c0,local_45e8);
                poVar3 = ::std::operator<<((ostream *)local_4580,(string *)local_45a0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_45a0);
                ::std::__cxx11::string::~string((string *)local_45e8);
                ::std::__cxx11::string::~string(local_45c0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_45c1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_15);
                ::std::__cxx11::string::~string((string *)&val_15);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_4580);
              }
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4408);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x25:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_3580);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<unsigned_int,2ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3580);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_36f8);
              poVar3 = ::std::operator<<((ostream *)local_36f8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_3738,"Failed to parse a value of type `{}`",&local_3739);
              tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_3718,(string *)local_3738,local_3760);
              poVar3 = ::std::operator<<((ostream *)local_36f8,(string *)local_3718);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_3718);
              ::std::__cxx11::string::~string((string *)local_3760);
              ::std::__cxx11::string::~string(local_3738);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_3739);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_12.
                              super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_12.
                          super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_36f8);
            }
            else {
              ::std::
              vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ::vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        *)local_3378);
              bVar1 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                                (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                       *)local_3378);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)local_3378);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_34f0);
                poVar3 = ::std::operator<<((ostream *)local_34f0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3530,"Failed to parse a value of type `{}[]`",&local_3531);
                tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_3510,(string *)local_3530,local_3558);
                poVar3 = ::std::operator<<((ostream *)local_34f0,(string *)local_3510);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_3510);
                ::std::__cxx11::string::~string((string *)local_3558);
                ::std::__cxx11::string::~string(local_3530);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3531);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_11);
                ::std::__cxx11::string::~string((string *)&val_11);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_34f0);
              }
              ::std::
              vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ::~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         *)local_3378);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x26:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(uint3 *)local_39a4);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<unsigned_int,3ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<unsigned_int,_3UL> *)local_39a4);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_3b20);
              poVar3 = ::std::operator<<((ostream *)local_3b20,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_3b60,"Failed to parse a value of type `{}`",&local_3b61);
              tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_3b40,(string *)local_3b60,local_3b88);
              poVar3 = ::std::operator<<((ostream *)local_3b20,(string *)local_3b40);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_3b40);
              ::std::__cxx11::string::~string((string *)local_3b88);
              ::std::__cxx11::string::~string(local_3b60);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_3b61);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_13.
                              super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_13.
                          super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_3b20);
            }
            else {
              ::std::
              vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
              ::vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        *)local_3798);
              bVar1 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                                (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                       *)local_3798);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)local_3798);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3910);
                poVar3 = ::std::operator<<((ostream *)local_3910,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3950,"Failed to parse a value of type `{}[]`",&local_3951);
                tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_3930,(string *)local_3950,local_3978);
                poVar3 = ::std::operator<<((ostream *)local_3910,(string *)local_3930);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_3930);
                ::std::__cxx11::string::~string((string *)local_3978);
                ::std::__cxx11::string::~string(local_3950);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3951);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_12._M_elems + 1));
                ::std::__cxx11::string::~string((string *)(val_12._M_elems + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_3910);
              }
              ::std::
              vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
              ::~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                         *)local_3798);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x27:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(uint4 *)local_3dd0);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<unsigned_int,4ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<unsigned_int,_4UL> *)local_3dd0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_3f48);
              poVar3 = ::std::operator<<((ostream *)local_3f48,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_3f88,"Failed to parse a value of type `{}`",&local_3f89);
              tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_3f68,(string *)local_3f88,local_3fb0);
              poVar3 = ::std::operator<<((ostream *)local_3f48,(string *)local_3f68);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_3f68);
              ::std::__cxx11::string::~string((string *)local_3fb0);
              ::std::__cxx11::string::~string(local_3f88);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_3f89);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_14.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_14.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_3f48);
            }
            else {
              ::std::
              vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
              ::vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                        *)local_3bc0);
              bVar1 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                                (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                       *)local_3bc0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                            *)local_3bc0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3d38);
                poVar3 = ::std::operator<<((ostream *)local_3d38,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3d78,"Failed to parse a value of type `{}[]`",&local_3d79);
                tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_3d58,(string *)local_3d78,local_3da0);
                poVar3 = ::std::operator<<((ostream *)local_3d38,(string *)local_3d58);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_3d58);
                ::std::__cxx11::string::~string((string *)local_3da0);
                ::std::__cxx11::string::~string(local_3d78);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3d79);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_13._M_elems + 2));
                ::std::__cxx11::string::~string((string *)(val_13._M_elems + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_3d38);
              }
              ::std::
              vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
              ::~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                         *)local_3bc0);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x28:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_4a2c);
              if (bVar1) {
                primvar::PrimVar::set_value<float>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4a2c);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_4ba8);
              poVar3 = ::std::operator<<((ostream *)local_4ba8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_4be8,"Failed to parse a value of type `{}`",&local_4be9);
              tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_4bc8,(string *)local_4be8,local_4c10);
              poVar3 = ::std::operator<<((ostream *)local_4ba8,(string *)local_4bc8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_4bc8);
              ::std::__cxx11::string::~string((string *)local_4c10);
              ::std::__cxx11::string::~string(local_4be8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_4be9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_17.
                              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_17.
                          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_4ba8);
            }
            else {
              ::std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_4828);
              bVar1 = ParseBasicTypeArray<float>
                                (this,(vector<float,_std::allocator<float>_> *)local_4828);
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<float,std::allocator<float>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<float,_std::allocator<float>_> *)local_4828);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_49a0);
                poVar3 = ::std::operator<<((ostream *)local_49a0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_49e0,"Failed to parse a value of type `{}[]`",&local_49e1);
                tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_49c0,(string *)local_49e0,local_4a08);
                poVar3 = ::std::operator<<((ostream *)local_49a0,(string *)local_49c0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_49c0);
                ::std::__cxx11::string::~string((string *)local_4a08);
                ::std::__cxx11::string::~string(local_49e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_49e1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_4a28);
                ::std::__cxx11::string::~string((string *)local_4a28);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_49a0);
              }
              ::std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_4828);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x29:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_4e50);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<float,2ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4e50);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_4fc8);
              poVar3 = ::std::operator<<((ostream *)local_4fc8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5008,"Failed to parse a value of type `{}`",&local_5009);
              tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_4fe8,(string *)local_5008,local_5030);
              poVar3 = ::std::operator<<((ostream *)local_4fc8,(string *)local_4fe8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_4fe8);
              ::std::__cxx11::string::~string((string *)local_5030);
              ::std::__cxx11::string::~string(local_5008);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5009);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_18.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_18.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_4fc8);
            }
            else {
              ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
              vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     local_4c48);
              bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                                (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                       *)local_4c48);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)local_4c48);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_4dc0);
                poVar3 = ::std::operator<<((ostream *)local_4dc0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_4e00,"Failed to parse a value of type `{}[]`",&local_4e01);
                tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_4de0,(string *)local_4e00,local_4e28);
                poVar3 = ::std::operator<<((ostream *)local_4dc0,(string *)local_4de0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_4de0);
                ::std::__cxx11::string::~string((string *)local_4e28);
                ::std::__cxx11::string::~string(local_4e00);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_4e01);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_17);
                ::std::__cxx11::string::~string((string *)&val_17);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_4dc0);
              }
              ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
              ~vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                      local_4c48);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2a:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(float3 *)local_5274);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<float,3ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<float,_3UL> *)local_5274);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_53f0);
              poVar3 = ::std::operator<<((ostream *)local_53f0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5430,"Failed to parse a value of type `{}`",&local_5431);
              tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_5410,(string *)local_5430,local_5458);
              poVar3 = ::std::operator<<((ostream *)local_53f0,(string *)local_5410);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_5410);
              ::std::__cxx11::string::~string((string *)local_5458);
              ::std::__cxx11::string::~string(local_5430);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5431);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_19.
                              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_19.
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_53f0);
            }
            else {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_5068);
              bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                                (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       *)local_5068);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)local_5068);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_51e0);
                poVar3 = ::std::operator<<((ostream *)local_51e0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_5220,"Failed to parse a value of type `{}[]`",&local_5221);
                tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_5200,(string *)local_5220,local_5248);
                poVar3 = ::std::operator<<((ostream *)local_51e0,(string *)local_5200);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_5200);
                ::std::__cxx11::string::~string((string *)local_5248);
                ::std::__cxx11::string::~string(local_5220);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_5221);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_18._M_elems + 1));
                ::std::__cxx11::string::~string((string *)(val_18._M_elems + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_51e0);
              }
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              ~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      local_5068);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2b:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(float4 *)local_56a0);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<float,4ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<float,_4UL> *)local_56a0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_5818);
              poVar3 = ::std::operator<<((ostream *)local_5818,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5858,"Failed to parse a value of type `{}`",&local_5859);
              tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_5838,(string *)local_5858,local_5880);
              poVar3 = ::std::operator<<((ostream *)local_5818,(string *)local_5838);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_5838);
              ::std::__cxx11::string::~string((string *)local_5880);
              ::std::__cxx11::string::~string(local_5858);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5859);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_5818);
            }
            else {
              ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
              vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     local_5490);
              bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                                (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                       *)local_5490);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            *)local_5490);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_5608);
                poVar3 = ::std::operator<<((ostream *)local_5608,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_5648,"Failed to parse a value of type `{}[]`",&local_5649);
                tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_5628,(string *)local_5648,local_5670);
                poVar3 = ::std::operator<<((ostream *)local_5608,(string *)local_5628);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_5628);
                ::std::__cxx11::string::~string((string *)local_5670);
                ::std::__cxx11::string::~string(local_5648);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_5649);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_19._M_elems + 2));
                ::std::__cxx11::string::~string((string *)(val_19._M_elems + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_5608);
              }
              ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
              ~vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      local_5490);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2c:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_5ac0);
              if (bVar1) {
                primvar::PrimVar::set_value<double>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5ac0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_5c38);
              poVar3 = ::std::operator<<((ostream *)local_5c38,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5c78,"Failed to parse a value of type `{}`",&local_5c79);
              tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_5c58,(string *)local_5c78,local_5ca0);
              poVar3 = ::std::operator<<((ostream *)local_5c38,(string *)local_5c58);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_5c58);
              ::std::__cxx11::string::~string((string *)local_5ca0);
              ::std::__cxx11::string::~string(local_5c78);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5c79);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_21.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_21.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_5c38);
            }
            else {
              ::std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)local_58b8);
              bVar1 = ParseBasicTypeArray<double>
                                (this,(vector<double,_std::allocator<double>_> *)local_58b8);
              if (bVar1) {
                primvar::PrimVar::set_value<std::vector<double,std::allocator<double>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<double,_std::allocator<double>_> *)local_58b8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_5a30);
                poVar3 = ::std::operator<<((ostream *)local_5a30,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_5a70,"Failed to parse a value of type `{}[]`",&local_5a71);
                tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_5a50,(string *)local_5a70,local_5a98);
                poVar3 = ::std::operator<<((ostream *)local_5a30,(string *)local_5a50);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_5a50);
                ::std::__cxx11::string::~string((string *)local_5a98);
                ::std::__cxx11::string::~string(local_5a70);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_5a71);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_20);
                ::std::__cxx11::string::~string((string *)&val_20);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_5a30);
              }
              ::std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)local_58b8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2d:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(double2 *)local_5ee8);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<double,2ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<double,_2UL> *)local_5ee8);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_6060);
              poVar3 = ::std::operator<<((ostream *)local_6060,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_60a0,"Failed to parse a value of type `{}`",&local_60a1);
              tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_6080,(string *)local_60a0,local_60c8);
              poVar3 = ::std::operator<<((ostream *)local_6060,(string *)local_6080);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_6080);
              ::std::__cxx11::string::~string((string *)local_60c8);
              ::std::__cxx11::string::~string(local_60a0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_60a1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_22.
                              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_22.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_6060);
            }
            else {
              ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_5cd8);
              bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                                (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                       *)local_5cd8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            *)local_5cd8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_5e50);
                poVar3 = ::std::operator<<((ostream *)local_5e50,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_5e90,"Failed to parse a value of type `{}[]`",&local_5e91);
                tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_5e70,(string *)local_5e90,local_5eb8);
                poVar3 = ::std::operator<<((ostream *)local_5e50,(string *)local_5e70);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_5e70);
                ::std::__cxx11::string::~string((string *)local_5eb8);
                ::std::__cxx11::string::~string(local_5e90);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_5e91);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_21._M_elems + 1));
                ::std::__cxx11::string::~string((string *)(val_21._M_elems + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_5e50);
              }
              ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              ~vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      local_5cd8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2e:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(double3 *)local_6318);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<double,3ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<double,_3UL> *)local_6318);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_6490);
              poVar3 = ::std::operator<<((ostream *)local_6490,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_64d0,"Failed to parse a value of type `{}`",&local_64d1);
              tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_64b0,(string *)local_64d0,local_64f8);
              poVar3 = ::std::operator<<((ostream *)local_6490,(string *)local_64b0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_64b0);
              ::std::__cxx11::string::~string((string *)local_64f8);
              ::std::__cxx11::string::~string(local_64d0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_64d1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_23.
                              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_23.
                          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_6490);
            }
            else {
              ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
              vector((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     local_6100);
              bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                                (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                       *)local_6100);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                            *)local_6100);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_6278);
                poVar3 = ::std::operator<<((ostream *)local_6278,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_62b8,"Failed to parse a value of type `{}[]`",&local_62b9);
                tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_6298,(string *)local_62b8,local_62e0);
                poVar3 = ::std::operator<<((ostream *)local_6278,(string *)local_6298);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_6298);
                ::std::__cxx11::string::~string((string *)local_62e0);
                ::std::__cxx11::string::~string(local_62b8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_62b9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_22._M_elems + 2));
                ::std::__cxx11::string::~string((string *)(val_22._M_elems + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_6278);
              }
              ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
              ~vector((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      local_6100);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x2f:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(double4 *)local_6750);
              if (bVar1) {
                primvar::PrimVar::set_value<std::array<double,4ul>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (array<double,_4UL> *)local_6750);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_68c8);
              poVar3 = ::std::operator<<((ostream *)local_68c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_6908,"Failed to parse a value of type `{}`",&local_6909);
              tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_68e8,(string *)local_6908,local_6930);
              poVar3 = ::std::operator<<((ostream *)local_68c8,(string *)local_68e8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_68e8);
              ::std::__cxx11::string::~string((string *)local_6930);
              ::std::__cxx11::string::~string(local_6908);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_6909);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_24.
                              super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_24.
                          super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_68c8);
            }
            else {
              ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
              vector((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     local_6530);
              bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                                (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                       *)local_6530);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            *)local_6530);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_66a8);
                poVar3 = ::std::operator<<((ostream *)local_66a8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_66e8,"Failed to parse a value of type `{}[]`",&local_66e9);
                tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_66c8,(string *)local_66e8,local_6710);
                poVar3 = ::std::operator<<((ostream *)local_66a8,(string *)local_66c8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_66c8);
                ::std::__cxx11::string::~string((string *)local_6710);
                ::std::__cxx11::string::~string(local_66e8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_66e9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_23._M_elems + 3));
                ::std::__cxx11::string::~string((string *)(val_23._M_elems + 3));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_66a8);
              }
              ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
              ~vector((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                      local_6530);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x30:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_8560);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::quath>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8560);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_86d8);
              poVar3 = ::std::operator<<((ostream *)local_86d8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_8718,"Failed to parse a value of type `{}`",&local_8719);
              tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_86f8,(string *)local_8718,local_8740);
              poVar3 = ::std::operator<<((ostream *)local_86d8,(string *)local_86f8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_86f8);
              ::std::__cxx11::string::~string((string *)local_8740);
              ::std::__cxx11::string::~string(local_8718);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_8719);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_31.
                              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_31.
                          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_86d8);
            }
            else {
              ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
                        ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                         local_8358);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                                (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                       *)local_8358);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            *)local_8358);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_84d0);
                poVar3 = ::std::operator<<((ostream *)local_84d0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_8510,"Failed to parse a value of type `{}[]`",&local_8511);
                tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_84f0,(string *)local_8510,local_8538);
                poVar3 = ::std::operator<<((ostream *)local_84d0,(string *)local_84f0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_84f0);
                ::std::__cxx11::string::~string((string *)local_8538);
                ::std::__cxx11::string::~string(local_8510);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_8511);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_30);
                ::std::__cxx11::string::~string((string *)&val_30);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_84d0);
              }
              ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
              ~vector((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                      local_8358);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x31:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(quatf *)local_8988);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::quatf>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(quatf *)local_8988);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_8b00);
              poVar3 = ::std::operator<<((ostream *)local_8b00,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_8b40,"Failed to parse a value of type `{}`",&local_8b41);
              tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_8b20,(string *)local_8b40,local_8b68);
              poVar3 = ::std::operator<<((ostream *)local_8b00,(string *)local_8b20);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_8b20);
              ::std::__cxx11::string::~string((string *)local_8b68);
              ::std::__cxx11::string::~string(local_8b40);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_8b41);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_32.
                              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_32.
                          super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_8b00);
            }
            else {
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                        ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         local_8778);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                                (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                       *)local_8778);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)local_8778);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_88f0);
                poVar3 = ::std::operator<<((ostream *)local_88f0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_8930,"Failed to parse a value of type `{}[]`",&local_8931);
                tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_8910,(string *)local_8930,local_8958);
                poVar3 = ::std::operator<<((ostream *)local_88f0,(string *)local_8910);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_8910);
                ::std::__cxx11::string::~string((string *)local_8958);
                ::std::__cxx11::string::~string(local_8930);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_8931);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_31.imag._M_elems + 2));
                ::std::__cxx11::string::~string((string *)(val_31.imag._M_elems + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_88f0);
              }
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              ~vector((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      local_8778);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x32:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(quatd *)local_8dc0);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::quatd>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(quatd *)local_8dc0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_8f38);
              poVar3 = ::std::operator<<((ostream *)local_8f38,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_8f78,"Failed to parse a value of type `{}`",&local_8f79);
              tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_8f58,(string *)local_8f78,local_8fa0);
              poVar3 = ::std::operator<<((ostream *)local_8f38,(string *)local_8f58);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_8f58);
              ::std::__cxx11::string::~string((string *)local_8fa0);
              ::std::__cxx11::string::~string(local_8f78);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_8f79);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_33.
                              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_33.
                          super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_8f38);
            }
            else {
              ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
                        ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                         local_8ba0);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                                (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                       *)local_8ba0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                            *)local_8ba0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_8d18);
                poVar3 = ::std::operator<<((ostream *)local_8d18,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_8d58,"Failed to parse a value of type `{}[]`",&local_8d59);
                tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_8d38,(string *)local_8d58,local_8d80);
                poVar3 = ::std::operator<<((ostream *)local_8d18,(string *)local_8d38);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_8d38);
                ::std::__cxx11::string::~string((string *)local_8d80);
                ::std::__cxx11::string::~string(local_8d58);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_8d59);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_32.real);
                ::std::__cxx11::string::~string((string *)&val_32.real);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_8d18);
              }
              ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
              ~vector((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                      local_8ba0);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x33:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix2f::matrix2f((matrix2f *)local_6b78);
              bVar1 = ReadBasicType(this,(matrix2f *)local_6b78);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix2f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix2f *)local_6b78
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_6cf0);
              poVar3 = ::std::operator<<((ostream *)local_6cf0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_6d30,"Failed to parse a value of type `{}`",&local_6d31);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_6d10,(string *)local_6d30,local_6d58);
              poVar3 = ::std::operator<<((ostream *)local_6cf0,(string *)local_6d10);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_6d10);
              ::std::__cxx11::string::~string((string *)local_6d58);
              ::std::__cxx11::string::~string(local_6d30);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_6d31);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_25.
                              super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_25.
                          super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_6cf0);
            }
            else {
              ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
              vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                      *)local_6968);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                                (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                       *)local_6968);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                            *)local_6968);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_6ae0);
                poVar3 = ::std::operator<<((ostream *)local_6ae0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_6b20,"Failed to parse a value of type `{}[]`",&local_6b21);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_6b00,(string *)local_6b20,local_6b48);
                poVar3 = ::std::operator<<((ostream *)local_6ae0,(string *)local_6b00);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_6b00);
                ::std::__cxx11::string::~string((string *)local_6b48);
                ::std::__cxx11::string::~string(local_6b20);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_6b21);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_24.m + 1));
                ::std::__cxx11::string::~string((string *)(val_24.m + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_6ae0);
              }
              ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
              ~vector((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                       *)local_6968);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x34:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix3f::matrix3f((matrix3f *)local_6fb4);
              bVar1 = ReadBasicType(this,(matrix3f *)local_6fb4);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix3f *)local_6fb4
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_7130);
              poVar3 = ::std::operator<<((ostream *)local_7130,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_7170,"Failed to parse a value of type `{}`",&local_7171);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_7150,(string *)local_7170,local_7198);
              poVar3 = ::std::operator<<((ostream *)local_7130,(string *)local_7150);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_7150);
              ::std::__cxx11::string::~string((string *)local_7198);
              ::std::__cxx11::string::~string(local_7170);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_7171);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_26.
                              super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_26.
                          super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_7130);
            }
            else {
              ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
              vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      *)local_6d90);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                                (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                       *)local_6d90);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                            *)local_6d90);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_6f08);
                poVar3 = ::std::operator<<((ostream *)local_6f08,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_6f48,"Failed to parse a value of type `{}[]`",&local_6f49);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_6f28,(string *)local_6f48,local_6f70);
                poVar3 = ::std::operator<<((ostream *)local_6f08,(string *)local_6f28);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_6f28);
                ::std::__cxx11::string::~string((string *)local_6f70);
                ::std::__cxx11::string::~string(local_6f48);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_6f49);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_25.m[2] + 1));
                ::std::__cxx11::string::~string((string *)(val_25.m[2] + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_6f08);
              }
              ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
              ~vector((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                       *)local_6d90);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x35:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_7410);
              bVar1 = ReadBasicType(this,(matrix4f *)local_7410);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix4f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix4f *)local_7410
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_7588);
              poVar3 = ::std::operator<<((ostream *)local_7588,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_75c8,"Failed to parse a value of type `{}`",&local_75c9);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_75a8,(string *)local_75c8,local_75f0);
              poVar3 = ::std::operator<<((ostream *)local_7588,(string *)local_75a8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_75a8);
              ::std::__cxx11::string::~string((string *)local_75f0);
              ::std::__cxx11::string::~string(local_75c8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_75c9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_27.
                              super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_27.
                          super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_7588);
            }
            else {
              ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
              vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                      *)local_71d0);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                                (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                       *)local_71d0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                            *)local_71d0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_7348);
                poVar3 = ::std::operator<<((ostream *)local_7348,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_7388,"Failed to parse a value of type `{}[]`",&local_7389);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_7368,(string *)local_7388,local_73b0);
                poVar3 = ::std::operator<<((ostream *)local_7348,(string *)local_7368);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_7368);
                ::std::__cxx11::string::~string((string *)local_73b0);
                ::std::__cxx11::string::~string(local_7388);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_7389);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_26.m[3] + 2));
                ::std::__cxx11::string::~string((string *)(val_26.m[3] + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_7348);
              }
              ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
              ~vector((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                       *)local_71d0);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x36:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix2d::matrix2d((matrix2d *)local_7848);
              bVar1 = ReadBasicType(this,(matrix2d *)local_7848);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix2d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix2d *)local_7848
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_79c0);
              poVar3 = ::std::operator<<((ostream *)local_79c0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_7a00,"Failed to parse a value of type `{}`",&local_7a01);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_79e0,(string *)local_7a00,local_7a28);
              poVar3 = ::std::operator<<((ostream *)local_79c0,(string *)local_79e0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_79e0);
              ::std::__cxx11::string::~string((string *)local_7a28);
              ::std::__cxx11::string::~string(local_7a00);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_7a01);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_28.
                              super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_28.
                          super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_79c0);
            }
            else {
              ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
              vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      *)local_7628);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                                (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                       *)local_7628);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                            *)local_7628);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_77a0);
                poVar3 = ::std::operator<<((ostream *)local_77a0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_77e0,"Failed to parse a value of type `{}[]`",&local_77e1);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_77c0,(string *)local_77e0,local_7808);
                poVar3 = ::std::operator<<((ostream *)local_77a0,(string *)local_77c0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_77c0);
                ::std::__cxx11::string::~string((string *)local_7808);
                ::std::__cxx11::string::~string(local_77e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_77e1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_27.m[1] + 1));
                ::std::__cxx11::string::~string((string *)(val_27.m[1] + 1));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_77a0);
              }
              ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
              ~vector((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       *)local_7628);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x37:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix3d::matrix3d((matrix3d *)local_7ca8);
              bVar1 = ReadBasicType(this,(matrix3d *)local_7ca8);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix3d *)local_7ca8
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_7e20);
              poVar3 = ::std::operator<<((ostream *)local_7e20,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_7e60,"Failed to parse a value of type `{}`",&local_7e61);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_7e40,(string *)local_7e60,local_7e88);
              poVar3 = ::std::operator<<((ostream *)local_7e20,(string *)local_7e40);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_7e40);
              ::std::__cxx11::string::~string((string *)local_7e88);
              ::std::__cxx11::string::~string(local_7e60);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_7e61);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_29.
                              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_29.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_7e20);
            }
            else {
              ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
              vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      *)local_7a60);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                                (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                       *)local_7a60);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                            *)local_7a60);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_7bd8);
                poVar3 = ::std::operator<<((ostream *)local_7bd8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_7c18,"Failed to parse a value of type `{}[]`",&local_7c19);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_7bf8,(string *)local_7c18,local_7c40);
                poVar3 = ::std::operator<<((ostream *)local_7bd8,(string *)local_7bf8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_7bf8);
                ::std::__cxx11::string::~string((string *)local_7c40);
                ::std::__cxx11::string::~string(local_7c18);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_7c19);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_28.m[2] + 2));
                ::std::__cxx11::string::~string((string *)(val_28.m[2] + 2));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_7bd8);
              }
              ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
              ~vector((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       *)local_7a60);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x38:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::matrix4d::matrix4d((matrix4d *)local_8140);
              bVar1 = ReadBasicType(this,(matrix4d *)local_8140);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::matrix4d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(matrix4d *)local_8140
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_82b8);
              poVar3 = ::std::operator<<((ostream *)local_82b8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_82f8,"Failed to parse a value of type `{}`",&local_82f9);
              tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_82d8,(string *)local_82f8,local_8320);
              poVar3 = ::std::operator<<((ostream *)local_82b8,(string *)local_82d8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_82d8);
              ::std::__cxx11::string::~string((string *)local_8320);
              ::std::__cxx11::string::~string(local_82f8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_82f9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_30.
                              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_30.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_82b8);
            }
            else {
              ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
              vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      *)local_7ec0);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                                (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                       *)local_7ec0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            *)local_7ec0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_8038);
                poVar3 = ::std::operator<<((ostream *)local_8038,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_8078,"Failed to parse a value of type `{}[]`",&local_8079);
                tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_8058,(string *)local_8078,local_80a0);
                poVar3 = ::std::operator<<((ostream *)local_8038,(string *)local_8058);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_8058);
                ::std::__cxx11::string::~string((string *)local_80a0);
                ::std::__cxx11::string::~string(local_8078);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_8079);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)(val_29.m[3] + 3));
                ::std::__cxx11::string::~string((string *)(val_29.m[3] + 3));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_8038);
              }
              ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
              ~vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)local_7ec0);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x3a:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(color3f *)local_b74c);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::color3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(color3f *)local_b74c)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_b8c8);
              poVar3 = ::std::operator<<((ostream *)local_b8c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_b908,"Failed to parse a value of type `{}`",&local_b909);
              tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_b8e8,(string *)local_b908,local_b930);
              poVar3 = ::std::operator<<((ostream *)local_b8c8,(string *)local_b8e8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_b8e8);
              ::std::__cxx11::string::~string((string *)local_b930);
              ::std::__cxx11::string::~string(local_b908);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_b909);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_43.
                              super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_43.
                          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_b8c8);
            }
            else {
              ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
              vector((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     local_b540);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::color3f>
                                (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                       *)local_b540);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                            *)local_b540);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_b6b8);
                poVar3 = ::std::operator<<((ostream *)local_b6b8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_b6f8,"Failed to parse a value of type `{}[]`",&local_b6f9);
                tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_b6d8,(string *)local_b6f8,local_b720);
                poVar3 = ::std::operator<<((ostream *)local_b6b8,(string *)local_b6d8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_b6d8);
                ::std::__cxx11::string::~string((string *)local_b720);
                ::std::__cxx11::string::~string(local_b6f8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_b6f9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_42.g);
                ::std::__cxx11::string::~string((string *)&val_42.g);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_b6b8);
              }
              ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
              ~vector((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
                      )local_b540);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x3b:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(color3d *)local_bb80);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::color3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(color3d *)local_bb80)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_bcf8);
              poVar3 = ::std::operator<<((ostream *)local_bcf8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_bd38,"Failed to parse a value of type `{}`",&local_bd39);
              tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_bd18,(string *)local_bd38,local_bd60);
              poVar3 = ::std::operator<<((ostream *)local_bcf8,(string *)local_bd18);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_bd18);
              ::std::__cxx11::string::~string((string *)local_bd60);
              ::std::__cxx11::string::~string(local_bd38);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_bd39);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_44.
                              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_44.
                          super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_bcf8);
            }
            else {
              ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
              vector((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     local_b968);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::color3d>
                                (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                       *)local_b968);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                            *)local_b968);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_bae0);
                poVar3 = ::std::operator<<((ostream *)local_bae0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_bb20,"Failed to parse a value of type `{}[]`",&local_bb21);
                tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_bb00,(string *)local_bb20,local_bb48);
                poVar3 = ::std::operator<<((ostream *)local_bae0,(string *)local_bb00);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_bb00);
                ::std::__cxx11::string::~string((string *)local_bb48);
                ::std::__cxx11::string::~string(local_bb20);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_bb21);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_43.b);
                ::std::__cxx11::string::~string((string *)&val_43.b);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_bae0);
              }
              ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
              ~vector((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *
                      )local_b968);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x3d:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(color4f *)local_bfa8);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::color4f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(color4f *)local_bfa8)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_c120);
              poVar3 = ::std::operator<<((ostream *)local_c120,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_c160,"Failed to parse a value of type `{}`",&local_c161);
              tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_c140,(string *)local_c160,local_c188);
              poVar3 = ::std::operator<<((ostream *)local_c120,(string *)local_c140);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_c140);
              ::std::__cxx11::string::~string((string *)local_c188);
              ::std::__cxx11::string::~string(local_c160);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_c161);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_45.
                              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_45.
                          super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_c120);
            }
            else {
              ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
              vector((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     local_bd98);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::color4f>
                                (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                       *)local_bd98);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                            *)local_bd98);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_bf10);
                poVar3 = ::std::operator<<((ostream *)local_bf10,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_bf50,"Failed to parse a value of type `{}[]`",&local_bf51);
                tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_bf30,(string *)local_bf50,local_bf78);
                poVar3 = ::std::operator<<((ostream *)local_bf10,(string *)local_bf30);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_bf30);
                ::std::__cxx11::string::~string((string *)local_bf78);
                ::std::__cxx11::string::~string(local_bf50);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_bf51);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_44.b);
                ::std::__cxx11::string::~string((string *)&val_44.b);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_bf10);
              }
              ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
              ~vector((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
                      )local_bd98);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x3e:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(color4d *)local_c3e0);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::color4d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(color4d *)local_c3e0)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_c558);
              poVar3 = ::std::operator<<((ostream *)local_c558,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_c598,"Failed to parse a value of type `{}`",&local_c599);
              tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_c578,(string *)local_c598,local_c5c0);
              poVar3 = ::std::operator<<((ostream *)local_c558,(string *)local_c578);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_c578);
              ::std::__cxx11::string::~string((string *)local_c5c0);
              ::std::__cxx11::string::~string(local_c598);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_c599);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_46.
                              super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_46.
                          super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_c558);
            }
            else {
              ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
              vector((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     local_c1c0);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::color4d>
                                (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                       *)local_c1c0);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                            *)local_c1c0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_c338);
                poVar3 = ::std::operator<<((ostream *)local_c338,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_c378,"Failed to parse a value of type `{}[]`",&local_c379);
                tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_c358,(string *)local_c378,local_c3a0);
                poVar3 = ::std::operator<<((ostream *)local_c338,(string *)local_c358);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_c358);
                ::std::__cxx11::string::~string((string *)local_c3a0);
                ::std::__cxx11::string::~string(local_c378);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_c379);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_45.a);
                ::std::__cxx11::string::~string((string *)&val_45.a);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_c338);
              }
              ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
              ~vector((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
                      )local_c1c0);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x3f:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_aace);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::point3h>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_aace);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_ac48);
              poVar3 = ::std::operator<<((ostream *)local_ac48,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_ac88,"Failed to parse a value of type `{}`",&local_ac89);
              tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_ac68,(string *)local_ac88,local_acb0);
              poVar3 = ::std::operator<<((ostream *)local_ac48,(string *)local_ac68);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_ac68);
              ::std::__cxx11::string::~string((string *)local_acb0);
              ::std::__cxx11::string::~string(local_ac88);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_ac89);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_40.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_40.
                          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_ac48);
            }
            else {
              ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
              vector((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     local_a8c8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::point3h>
                                (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                       *)local_a8c8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                            *)local_a8c8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_aa40);
                poVar3 = ::std::operator<<((ostream *)local_aa40,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_aa80,"Failed to parse a value of type `{}[]`",&local_aa81);
                tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_aa60,(string *)local_aa80,local_aaa8);
                poVar3 = ::std::operator<<((ostream *)local_aa40,(string *)local_aa60);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_aa60);
                ::std::__cxx11::string::~string((string *)local_aaa8);
                ::std::__cxx11::string::~string(local_aa80);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_aa81);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_aac8);
                ::std::__cxx11::string::~string((string *)local_aac8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_aa40);
              }
              ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
              ~vector((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
                      )local_a8c8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x40:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(point3f *)local_aef4);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::point3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(point3f *)local_aef4)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_b070);
              poVar3 = ::std::operator<<((ostream *)local_b070,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_b0b0,"Failed to parse a value of type `{}`",&local_b0b1);
              tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_b090,(string *)local_b0b0,local_b0d8);
              poVar3 = ::std::operator<<((ostream *)local_b070,(string *)local_b090);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_b090);
              ::std::__cxx11::string::~string((string *)local_b0d8);
              ::std::__cxx11::string::~string(local_b0b0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_b0b1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_41.
                              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_41.
                          super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_b070);
            }
            else {
              ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
              vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     local_ace8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::point3f>
                                (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                       *)local_ace8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                            *)local_ace8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_ae60);
                poVar3 = ::std::operator<<((ostream *)local_ae60,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_aea0,"Failed to parse a value of type `{}[]`",&local_aea1);
                tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_ae80,(string *)local_aea0,local_aec8);
                poVar3 = ::std::operator<<((ostream *)local_ae60,(string *)local_ae80);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_ae80);
                ::std::__cxx11::string::~string((string *)local_aec8);
                ::std::__cxx11::string::~string(local_aea0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_aea1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_40.y);
                ::std::__cxx11::string::~string((string *)&val_40.y);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_ae60);
              }
              ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
              ~vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                      )local_ace8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x41:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(point3d *)local_b328);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::point3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(point3d *)local_b328)
                ;
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_b4a0);
              poVar3 = ::std::operator<<((ostream *)local_b4a0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_b4e0,"Failed to parse a value of type `{}`",&local_b4e1);
              tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_b4c0,(string *)local_b4e0,local_b508);
              poVar3 = ::std::operator<<((ostream *)local_b4a0,(string *)local_b4c0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_b4c0);
              ::std::__cxx11::string::~string((string *)local_b508);
              ::std::__cxx11::string::~string(local_b4e0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_b4e1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_42.
                              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_42.
                          super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_b4a0);
            }
            else {
              ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
              vector((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     local_b110);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::point3d>
                                (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                       *)local_b110);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                            *)local_b110);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_b288);
                poVar3 = ::std::operator<<((ostream *)local_b288,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_b2c8,"Failed to parse a value of type `{}[]`",&local_b2c9);
                tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_b2a8,(string *)local_b2c8,local_b2f0);
                poVar3 = ::std::operator<<((ostream *)local_b288,(string *)local_b2a8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_b2a8);
                ::std::__cxx11::string::~string((string *)local_b2f0);
                ::std::__cxx11::string::~string(local_b2c8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_b2c9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_41.z);
                ::std::__cxx11::string::~string((string *)&val_41.z);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_b288);
              }
              ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
              ~vector((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
                      )local_b110);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x42:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_91de);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::normal3h>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_91de);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_9358);
              poVar3 = ::std::operator<<((ostream *)local_9358,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_9398,"Failed to parse a value of type `{}`",&local_9399);
              tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_9378,(string *)local_9398,local_93c0);
              poVar3 = ::std::operator<<((ostream *)local_9358,(string *)local_9378);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_9378);
              ::std::__cxx11::string::~string((string *)local_93c0);
              ::std::__cxx11::string::~string(local_9398);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_9399);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_34.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_34.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_9358);
            }
            else {
              ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
              vector((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)local_8fd8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                                (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                       *)local_8fd8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                            *)local_8fd8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_9150);
                poVar3 = ::std::operator<<((ostream *)local_9150,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_9190,"Failed to parse a value of type `{}[]`",&local_9191);
                tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_9170,(string *)local_9190,local_91b8);
                poVar3 = ::std::operator<<((ostream *)local_9150,(string *)local_9170);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_9170);
                ::std::__cxx11::string::~string((string *)local_91b8);
                ::std::__cxx11::string::~string(local_9190);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_9191);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_91d8);
                ::std::__cxx11::string::~string((string *)local_91d8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_9150);
              }
              ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
              ~vector((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)local_8fd8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x43:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(normal3f *)local_9604);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::normal3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(normal3f *)local_9604
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_9780);
              poVar3 = ::std::operator<<((ostream *)local_9780,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_97c0,"Failed to parse a value of type `{}`",&local_97c1);
              tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_97a0,(string *)local_97c0,local_97e8);
              poVar3 = ::std::operator<<((ostream *)local_9780,(string *)local_97a0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_97a0);
              ::std::__cxx11::string::~string((string *)local_97e8);
              ::std::__cxx11::string::~string(local_97c0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_97c1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_35.
                              super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_35.
                          super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_9780);
            }
            else {
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)local_93f8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                                (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                       *)local_93f8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            *)local_93f8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_9570);
                poVar3 = ::std::operator<<((ostream *)local_9570,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_95b0,"Failed to parse a value of type `{}[]`",&local_95b1);
                tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_9590,(string *)local_95b0,local_95d8);
                poVar3 = ::std::operator<<((ostream *)local_9570,(string *)local_9590);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_9590);
                ::std::__cxx11::string::~string((string *)local_95d8);
                ::std::__cxx11::string::~string(local_95b0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_95b1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_34.y);
                ::std::__cxx11::string::~string((string *)&val_34.y);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_9570);
              }
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)local_93f8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x44:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(normal3d *)local_9a38);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::normal3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(normal3d *)local_9a38
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_9bb0);
              poVar3 = ::std::operator<<((ostream *)local_9bb0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_9bf0,"Failed to parse a value of type `{}`",&local_9bf1);
              tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_9bd0,(string *)local_9bf0,local_9c18);
              poVar3 = ::std::operator<<((ostream *)local_9bb0,(string *)local_9bd0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_9bd0);
              ::std::__cxx11::string::~string((string *)local_9c18);
              ::std::__cxx11::string::~string(local_9bf0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_9bf1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_36.
                              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_36.
                          super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_9bb0);
            }
            else {
              ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
              vector((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)local_9820);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                                (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                       *)local_9820);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                            *)local_9820);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_9998);
                poVar3 = ::std::operator<<((ostream *)local_9998,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_99d8,"Failed to parse a value of type `{}[]`",&local_99d9);
                tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_99b8,(string *)local_99d8,local_9a00);
                poVar3 = ::std::operator<<((ostream *)local_9998,(string *)local_99b8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_99b8);
                ::std::__cxx11::string::~string((string *)local_9a00);
                ::std::__cxx11::string::~string(local_99d8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_99d9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_35.z);
                ::std::__cxx11::string::~string((string *)&val_35.z);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_9998);
              }
              ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
              ~vector((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)local_9820);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x45:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_9e56);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::vector3h>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_9e56);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_9fd0);
              poVar3 = ::std::operator<<((ostream *)local_9fd0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_a010,"Failed to parse a value of type `{}`",&local_a011);
              tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_9ff0,(string *)local_a010,local_a038);
              poVar3 = ::std::operator<<((ostream *)local_9fd0,(string *)local_9ff0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_9ff0);
              ::std::__cxx11::string::~string((string *)local_a038);
              ::std::__cxx11::string::~string(local_a010);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_a011);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_37.
                              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_37.
                          super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_9fd0);
            }
            else {
              ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
              vector((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)local_9c50);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                                (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                       *)local_9c50);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                            *)local_9c50);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_9dc8);
                poVar3 = ::std::operator<<((ostream *)local_9dc8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_9e08,"Failed to parse a value of type `{}[]`",&local_9e09);
                tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_9de8,(string *)local_9e08,local_9e30);
                poVar3 = ::std::operator<<((ostream *)local_9dc8,(string *)local_9de8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_9de8);
                ::std::__cxx11::string::~string((string *)local_9e30);
                ::std::__cxx11::string::~string(local_9e08);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_9e09);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_9e50);
                ::std::__cxx11::string::~string((string *)local_9e50);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_9dc8);
              }
              ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
              ~vector((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)local_9c50);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x46:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(vector3f *)local_a27c);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::vector3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(vector3f *)local_a27c
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_a3f8);
              poVar3 = ::std::operator<<((ostream *)local_a3f8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_a438,"Failed to parse a value of type `{}`",&local_a439);
              tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_a418,(string *)local_a438,local_a460);
              poVar3 = ::std::operator<<((ostream *)local_a3f8,(string *)local_a418);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_a418);
              ::std::__cxx11::string::~string((string *)local_a460);
              ::std::__cxx11::string::~string(local_a438);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_a439);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_38.
                              super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_38.
                          super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_a3f8);
            }
            else {
              ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
              vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)local_a070);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                                (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                       *)local_a070);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                            *)local_a070);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_a1e8);
                poVar3 = ::std::operator<<((ostream *)local_a1e8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_a228,"Failed to parse a value of type `{}[]`",&local_a229);
                tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_a208,(string *)local_a228,local_a250);
                poVar3 = ::std::operator<<((ostream *)local_a1e8,(string *)local_a208);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_a208);
                ::std::__cxx11::string::~string((string *)local_a250);
                ::std::__cxx11::string::~string(local_a228);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_a229);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_37.y);
                ::std::__cxx11::string::~string((string *)&val_37.y);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_a1e8);
              }
              ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
              ~vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)local_a070);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x47:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(vector3d *)local_a6b0);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::vector3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(vector3d *)local_a6b0
                          );
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_a828);
              poVar3 = ::std::operator<<((ostream *)local_a828,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_a868,"Failed to parse a value of type `{}`",&local_a869);
              tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_a848,(string *)local_a868,local_a890);
              poVar3 = ::std::operator<<((ostream *)local_a828,(string *)local_a848);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_a848);
              ::std::__cxx11::string::~string((string *)local_a890);
              ::std::__cxx11::string::~string(local_a868);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_a869);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_39.
                              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_39.
                          super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_a828);
            }
            else {
              ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
              vector((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)local_a498);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                                (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                       *)local_a498);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                            *)local_a498);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_a610);
                poVar3 = ::std::operator<<((ostream *)local_a610,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_a650,"Failed to parse a value of type `{}[]`",&local_a651);
                tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_a630,(string *)local_a650,local_a678);
                poVar3 = ::std::operator<<((ostream *)local_a610,(string *)local_a630);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_a630);
                ::std::__cxx11::string::~string((string *)local_a678);
                ::std::__cxx11::string::~string(local_a650);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_a651);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_38.z);
                ::std::__cxx11::string::~string((string *)&val_38.z);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_a610);
              }
              ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
              ~vector((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)local_a498);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x49:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_c7fc);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord2h>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c7fc);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_c978);
              poVar3 = ::std::operator<<((ostream *)local_c978,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_c9b8,"Failed to parse a value of type `{}`",&local_c9b9);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_c998,(string *)local_c9b8,local_c9e0);
              poVar3 = ::std::operator<<((ostream *)local_c978,(string *)local_c998);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_c998);
              ::std::__cxx11::string::~string((string *)local_c9e0);
              ::std::__cxx11::string::~string(local_c9b8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_c9b9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_47.
                              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_47.
                          super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_c978);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
              vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)local_c5f8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                                (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                       *)local_c5f8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                            *)local_c5f8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_c770);
                poVar3 = ::std::operator<<((ostream *)local_c770,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_c7b0,"Failed to parse a value of type `{}[]`",&local_c7b1);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_c790,(string *)local_c7b0,local_c7d8);
                poVar3 = ::std::operator<<((ostream *)local_c770,(string *)local_c790);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_c790);
                ::std::__cxx11::string::~string((string *)local_c7d8);
                ::std::__cxx11::string::~string(local_c7b0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_c7b1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_c7f8);
                ::std::__cxx11::string::~string((string *)local_c7f8);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_c770);
              }
              ::std::
              vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
              ~vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)local_c5f8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x4a:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_cc20);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord2f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_cc20);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_cd98);
              poVar3 = ::std::operator<<((ostream *)local_cd98,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_cdd8,"Failed to parse a value of type `{}`",&local_cdd9);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_cdb8,(string *)local_cdd8,local_ce00);
              poVar3 = ::std::operator<<((ostream *)local_cd98,(string *)local_cdb8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_cdb8);
              ::std::__cxx11::string::~string((string *)local_ce00);
              ::std::__cxx11::string::~string(local_cdd8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_cdd9);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_48.
                              super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_48.
                          super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_cd98);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
              vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)local_ca18);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                                (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                       *)local_ca18);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                            *)local_ca18);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_cb90);
                poVar3 = ::std::operator<<((ostream *)local_cb90,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_cbd0,"Failed to parse a value of type `{}[]`",&local_cbd1);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_cbb0,(string *)local_cbd0,local_cbf8);
                poVar3 = ::std::operator<<((ostream *)local_cb90,(string *)local_cbb0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_cbb0);
                ::std::__cxx11::string::~string((string *)local_cbf8);
                ::std::__cxx11::string::~string(local_cbd0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_cbd1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_47);
                ::std::__cxx11::string::~string((string *)&val_47);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_cb90);
              }
              ::std::
              vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
              ~vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)local_ca18);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x4b:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(texcoord2d *)local_d048);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord2d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (texcoord2d *)local_d048);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_d1c0);
              poVar3 = ::std::operator<<((ostream *)local_d1c0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_d200,"Failed to parse a value of type `{}`",&local_d201);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_d1e0,(string *)local_d200,local_d228);
              poVar3 = ::std::operator<<((ostream *)local_d1c0,(string *)local_d1e0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_d1e0);
              ::std::__cxx11::string::~string((string *)local_d228);
              ::std::__cxx11::string::~string(local_d200);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_d201);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_49.
                              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_49.
                          super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_d1c0);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
              vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)local_ce38);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                                (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                       *)local_ce38);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                            *)local_ce38);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_cfb0);
                poVar3 = ::std::operator<<((ostream *)local_cfb0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_cff0,"Failed to parse a value of type `{}[]`",&local_cff1);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_cfd0,(string *)local_cff0,local_d018);
                poVar3 = ::std::operator<<((ostream *)local_cfb0,(string *)local_cfd0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_cfd0);
                ::std::__cxx11::string::~string((string *)local_d018);
                ::std::__cxx11::string::~string(local_cff0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_cff1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_48.t);
                ::std::__cxx11::string::~string((string *)&val_48.t);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_cfb0);
              }
              ::std::
              vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
              ~vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)local_ce38);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x4c:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,&local_d466);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord3h>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d466);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_d5e0);
              poVar3 = ::std::operator<<((ostream *)local_d5e0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_d620,"Failed to parse a value of type `{}`",&local_d621);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_d600,(string *)local_d620,local_d648);
              poVar3 = ::std::operator<<((ostream *)local_d5e0,(string *)local_d600);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_d600);
              ::std::__cxx11::string::~string((string *)local_d648);
              ::std::__cxx11::string::~string(local_d620);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_d621);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_50.
                              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_50.
                          super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_d5e0);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
              vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)local_d260);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                                (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                       *)local_d260);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            *)local_d260);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_d3d8);
                poVar3 = ::std::operator<<((ostream *)local_d3d8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_d418,"Failed to parse a value of type `{}[]`",&local_d419);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_d3f8,(string *)local_d418,local_d440);
                poVar3 = ::std::operator<<((ostream *)local_d3d8,(string *)local_d3f8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_d3f8);
                ::std::__cxx11::string::~string((string *)local_d440);
                ::std::__cxx11::string::~string(local_d418);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_d419);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)local_d460);
                ::std::__cxx11::string::~string((string *)local_d460);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_d3d8);
              }
              ::std::
              vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
              ~vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)local_d260);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x4d:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(texcoord3f *)local_d88c);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord3f>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (texcoord3f *)local_d88c);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_da08);
              poVar3 = ::std::operator<<((ostream *)local_da08,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_da48,"Failed to parse a value of type `{}`",&local_da49);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_da28,(string *)local_da48,local_da70);
              poVar3 = ::std::operator<<((ostream *)local_da08,(string *)local_da28);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_da28);
              ::std::__cxx11::string::~string((string *)local_da70);
              ::std::__cxx11::string::~string(local_da48);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_da49);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &vss_51.
                              super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &vss_51.
                          super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_da08);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
              vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)local_d680);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                                (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                       *)local_d680);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                            *)local_d680);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_d7f8);
                poVar3 = ::std::operator<<((ostream *)local_d7f8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_d838,"Failed to parse a value of type `{}[]`",&local_d839);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_d818,(string *)local_d838,local_d860);
                poVar3 = ::std::operator<<((ostream *)local_d7f8,(string *)local_d818);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_d818);
                ::std::__cxx11::string::~string((string *)local_d860);
                ::std::__cxx11::string::~string(local_d838);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_d839);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_50.t);
                ::std::__cxx11::string::~string((string *)&val_50.t);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_d7f8);
              }
              ::std::
              vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
              ~vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)local_d680);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x4e:
            if ((local_229 & 1) == 0) {
              bVar1 = ReadBasicType(this,(texcoord3d *)local_dcc0);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::texcoord3d>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (texcoord3d *)local_dcc0);
                goto LAB_004ea2e4;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_de38);
              poVar3 = ::std::operator<<((ostream *)local_de38,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_de78,"Failed to parse a value of type `{}`",&local_de79);
              tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string>(local_de58,(string *)local_de78,local_dea0);
              poVar3 = ::std::operator<<((ostream *)local_de38,(string *)local_de58);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_de58);
              ::std::__cxx11::string::~string((string *)local_dea0);
              ::std::__cxx11::string::~string(local_de78);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_de79);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)
                             &strs.
                              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &strs.
                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_de38);
            }
            else {
              ::std::
              vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
              vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)local_daa8);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                                (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                       *)local_daa8);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                            *)local_daa8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_dc20);
                poVar3 = ::std::operator<<((ostream *)local_dc20,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x353);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_dc60,"Failed to parse a value of type `{}[]`",&local_dc61);
                tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string>(local_dc40,(string *)local_dc60,local_dc88);
                poVar3 = ::std::operator<<((ostream *)local_dc20,(string *)local_dc40);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_dc40);
                ::std::__cxx11::string::~string((string *)local_dc88);
                ::std::__cxx11::string::~string(local_dc60);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_dc61);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&val_51.r);
                ::std::__cxx11::string::~string((string *)&val_51.r);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_dc20);
              }
              ::std::
              vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
              ~vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)local_daa8);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x51:
            if ((local_229 & 1) == 0) {
              tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_e428);
              bVar1 = ReadBasicType(this,(AssetPath *)local_e428);
              if (bVar1) {
                primvar::PrimVar::set_value<tinyusdz::value::AssetPath>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (AssetPath *)local_e428);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_e5a0);
                poVar3 = ::std::operator<<((ostream *)local_e5a0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x36f);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_e5a0,"Failed to parse `asset`");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::std::__cxx11::string::~string
                          ((string *)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_e5a0);
              }
              tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_e428);
              if (bVar1) goto LAB_004ea2e4;
            }
            else {
              ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
              ::vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                        *)local_e250);
              bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                                (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                       *)local_e250);
              if (bVar1) {
                primvar::PrimVar::
                set_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                          ((PrimVar *)
                           &vss.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                            *)local_e250);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_e3c8);
                poVar3 = ::std::operator<<((ostream *)local_e3c8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x369);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_e3c8,"Failed to parse `asset[]`");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)((long)&asset.resolved_path_.field_2 + 8));
                ::std::__cxx11::string::~string
                          ((string *)(asset.resolved_path_.field_2._M_local_buf + 8));
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_e3c8);
              }
              ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
              ::~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)local_e250);
              if (bVar1) goto LAB_004ea2e4;
            }
            break;
          case 0x52:
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)local_e5f0);
            bVar1 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                    *)local_e5f0);
            if (bVar1) {
              primvar::PrimVar::
              set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                        ((PrimVar *)
                         &vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                          *)local_e5f0);
              local_4c = 8;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_e768);
              poVar3 = ::std::operator<<((ostream *)local_e768,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x37a);
              ::std::operator<<(poVar3," ");
              poVar3 = ::std::operator<<((ostream *)local_e768,"Failed to parse `dictionary`");
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_e788);
              ::std::__cxx11::string::~string((string *)&local_e788);
              this_local._7_1_ = 0;
              local_4c = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_e768);
            }
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_e5f0);
            if (local_4c == 8) goto LAB_004ea2e4;
          }
          primvar::PrimVar::~PrimVar
                    ((PrimVar *)
                     &vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_560);
    poVar3 = ::std::operator<<((ostream *)local_560,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseDictElement");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x322);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_560,"Failed to parse dictionary key identifier.\n");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)local_580);
    ::std::__cxx11::string::~string((string *)local_580);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_560);
  }
  ::std::__cxx11::string::~string((string *)local_3e8);
LAB_004ea361:
  ::std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseDictElement(std::string *out_key,
                                   MetaVariable *out_var) {
  (void)out_key;
  (void)out_var;

  // dict_element: type (array_qual?) name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!IsSupportedPrimAttrType(type_name)) {
    PUSH_ERROR_AND_RETURN("Unknown or unsupported type `" + type_name + "`\n");
  }

  // Has array qualifier? `[]`
  bool array_qual = false;
  {
    char c0, c1;
    if (!Char1(&c0)) {
      return false;
    }

    if (c0 == '[') {
      if (!Char1(&c1)) {
        return false;
      }

      if (c1 == ']') {
        array_qual = true;
      } else {
        // Invalid syntax
        PUSH_ERROR_AND_RETURN("Invalid syntax found.");
      }

    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  uint32_t tyid = value::GetTypeId(type_name);

  primvar::PrimVar var;

  //
  // Supports limited types for customData/Dictionary.
  //

  // TODO: Unify code with ParseMetaValue()

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  switch (tyid) {
    APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
    case value::TYPE_ID_STRING: {
      // FIXME: Use std::string
      if (array_qual) {
        std::vector<value::StringData> strs;
        if (!ParseBasicTypeArray(&strs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
        }
        var.set_value(strs);
      } else {
        value::StringData str;
        if (!ReadBasicType(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string`");
        }
        var.set_value(str);
      }
      break;
    }
    case value::TYPE_ID_ASSET_PATH: {
      if (array_qual) {
        std::vector<value::AssetPath> arrs;
        if (!ParseBasicTypeArray(&arrs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
        }
        var.set_value(arrs);
      } else {
        value::AssetPath asset;
        if (!ReadBasicType(&asset)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
        }
        var.set_value(asset);
      }
      break;
    }
    case value::TYPE_ID_DICT: {
      Dictionary dict;

      DCOUT("Parse dictionary");
      if (!ParseDict(&dict)) {
        PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
      }
      var.set_value(dict);
      break;
    }
    default: {
      PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                            type_name);
    }
  }

#undef PARSE_BASE_TYPE

  MetaVariable metavar;
  metavar.set_value(key_name, var.value_raw());

  DCOUT("key: " << key_name << ", type: " << type_name);

  (*out_key) = key_name;
  (*out_var) = metavar;

  return true;
}